

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::avx512::CurveNvIntersectorK<8,4>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive PVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined8 uVar11;
  ulong uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [12];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  byte bVar67;
  byte bVar68;
  ulong uVar69;
  long lVar70;
  byte bVar71;
  ulong uVar72;
  byte bVar73;
  byte bVar74;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  Primitive *pPVar75;
  uint uVar76;
  bool bVar77;
  bool bVar78;
  ulong uVar79;
  uint uVar80;
  undefined1 auVar90 [16];
  uint uVar132;
  uint uVar133;
  uint uVar135;
  uint uVar136;
  uint uVar137;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  uint uVar134;
  uint uVar138;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float pp;
  float fVar139;
  float fVar140;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined4 uVar160;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar161 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  float fVar176;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar200;
  float fVar201;
  undefined1 auVar195 [32];
  float fVar202;
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar203;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar222;
  undefined1 auVar212 [16];
  float fVar211;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar220;
  float fVar221;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar223 [16];
  float fVar226;
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [64];
  float fVar232;
  undefined1 auVar233 [32];
  float fVar235;
  float fVar236;
  float fVar237;
  undefined1 auVar234 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [28];
  float fVar241;
  undefined1 auVar242 [64];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [32];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  undefined1 local_9e0 [16];
  uint local_9d0;
  int local_9cc;
  float local_9c8;
  float local_9c4;
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_770 [16];
  ulong local_758;
  RTCFilterFunctionNArguments local_750;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  Primitive *local_5b8;
  Primitive *local_5b0;
  ulong local_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 auStack_550 [16];
  undefined1 local_540 [32];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  RTCHitN local_4e0 [16];
  undefined1 auStack_4d0 [16];
  undefined4 local_4c0;
  undefined4 uStack_4bc;
  undefined4 uStack_4b8;
  undefined4 uStack_4b4;
  float local_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [16];
  undefined8 local_490;
  undefined8 uStack_488;
  undefined1 local_480 [16];
  uint local_470;
  uint uStack_46c;
  uint uStack_468;
  uint uStack_464;
  uint uStack_460;
  uint uStack_45c;
  uint uStack_458;
  uint uStack_454;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_390 [16];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar247 [64];
  
  PVar1 = prim[1];
  uVar79 = (ulong)(byte)PVar1;
  lVar70 = uVar79 * 0x19;
  fVar232 = *(float *)(prim + lVar70 + 0x12);
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar87 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar223 = vsubps_avx(auVar83,*(undefined1 (*) [16])(prim + lVar70 + 6));
  fVar203 = fVar232 * auVar223._0_4_;
  fVar139 = fVar232 * auVar87._0_4_;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar79 * 4 + 6);
  auVar96 = vpmovsxbd_avx2(auVar83);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar79 * 5 + 6);
  auVar94 = vpmovsxbd_avx2(auVar84);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar79 * 6 + 6);
  auVar97 = vpmovsxbd_avx2(auVar85);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar79 * 0xb + 6);
  auVar98 = vpmovsxbd_avx2(auVar89);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6);
  auVar103 = vpmovsxbd_avx2(auVar81);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar99 = vcvtdq2ps_avx(auVar103);
  auVar212._8_8_ = 0;
  auVar212._0_8_ = *(ulong *)(prim + (uint)(byte)PVar1 * 0xc + uVar79 + 6);
  auVar95 = vpmovsxbd_avx2(auVar212);
  auVar95 = vcvtdq2ps_avx(auVar95);
  uVar69 = (ulong)(uint)((int)(uVar79 * 9) * 2);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar69 + 6);
  auVar100 = vpmovsxbd_avx2(auVar86);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar69 + uVar79 + 6);
  auVar101 = vpmovsxbd_avx2(auVar82);
  auVar101 = vcvtdq2ps_avx(auVar101);
  uVar72 = (ulong)(uint)((int)(uVar79 * 5) << 2);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar72 + 6);
  auVar93 = vpmovsxbd_avx2(auVar88);
  auVar102 = vcvtdq2ps_avx(auVar93);
  auVar113._4_4_ = fVar139;
  auVar113._0_4_ = fVar139;
  auVar113._8_4_ = fVar139;
  auVar113._12_4_ = fVar139;
  auVar113._16_4_ = fVar139;
  auVar113._20_4_ = fVar139;
  auVar113._24_4_ = fVar139;
  auVar113._28_4_ = fVar139;
  auVar115._8_4_ = 1;
  auVar115._0_8_ = 0x100000001;
  auVar115._12_4_ = 1;
  auVar115._16_4_ = 1;
  auVar115._20_4_ = 1;
  auVar115._24_4_ = 1;
  auVar115._28_4_ = 1;
  auVar91 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar105 = ZEXT1632(CONCAT412(fVar232 * auVar87._12_4_,
                                CONCAT48(fVar232 * auVar87._8_4_,
                                         CONCAT44(fVar232 * auVar87._4_4_,fVar139))));
  auVar104 = vpermps_avx2(auVar115,auVar105);
  auVar92 = vpermps_avx512vl(auVar91,auVar105);
  fVar139 = auVar92._0_4_;
  fVar235 = auVar92._4_4_;
  auVar105._4_4_ = fVar235 * auVar97._4_4_;
  auVar105._0_4_ = fVar139 * auVar97._0_4_;
  fVar236 = auVar92._8_4_;
  auVar105._8_4_ = fVar236 * auVar97._8_4_;
  fVar237 = auVar92._12_4_;
  auVar105._12_4_ = fVar237 * auVar97._12_4_;
  fVar208 = auVar92._16_4_;
  auVar105._16_4_ = fVar208 * auVar97._16_4_;
  fVar209 = auVar92._20_4_;
  auVar105._20_4_ = fVar209 * auVar97._20_4_;
  fVar210 = auVar92._24_4_;
  auVar105._24_4_ = fVar210 * auVar97._24_4_;
  auVar105._28_4_ = auVar103._28_4_;
  auVar103._4_4_ = auVar95._4_4_ * fVar235;
  auVar103._0_4_ = auVar95._0_4_ * fVar139;
  auVar103._8_4_ = auVar95._8_4_ * fVar236;
  auVar103._12_4_ = auVar95._12_4_ * fVar237;
  auVar103._16_4_ = auVar95._16_4_ * fVar208;
  auVar103._20_4_ = auVar95._20_4_ * fVar209;
  auVar103._24_4_ = auVar95._24_4_ * fVar210;
  auVar103._28_4_ = auVar93._28_4_;
  auVar93._4_4_ = auVar102._4_4_ * fVar235;
  auVar93._0_4_ = auVar102._0_4_ * fVar139;
  auVar93._8_4_ = auVar102._8_4_ * fVar236;
  auVar93._12_4_ = auVar102._12_4_ * fVar237;
  auVar93._16_4_ = auVar102._16_4_ * fVar208;
  auVar93._20_4_ = auVar102._20_4_ * fVar209;
  auVar93._24_4_ = auVar102._24_4_ * fVar210;
  auVar93._28_4_ = auVar92._28_4_;
  auVar83 = vfmadd231ps_fma(auVar105,auVar104,auVar94);
  auVar84 = vfmadd231ps_fma(auVar103,auVar104,auVar99);
  auVar85 = vfmadd231ps_fma(auVar93,auVar101,auVar104);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar113,auVar96);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar113,auVar98);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar100,auVar113);
  auVar114._4_4_ = fVar203;
  auVar114._0_4_ = fVar203;
  auVar114._8_4_ = fVar203;
  auVar114._12_4_ = fVar203;
  auVar114._16_4_ = fVar203;
  auVar114._20_4_ = fVar203;
  auVar114._24_4_ = fVar203;
  auVar114._28_4_ = fVar203;
  auVar93 = ZEXT1632(CONCAT412(fVar232 * auVar223._12_4_,
                               CONCAT48(fVar232 * auVar223._8_4_,
                                        CONCAT44(fVar232 * auVar223._4_4_,fVar203))));
  auVar103 = vpermps_avx2(auVar115,auVar93);
  auVar93 = vpermps_avx512vl(auVar91,auVar93);
  fVar232 = auVar93._0_4_;
  fVar139 = auVar93._4_4_;
  auVar104._4_4_ = fVar139 * auVar97._4_4_;
  auVar104._0_4_ = fVar232 * auVar97._0_4_;
  fVar235 = auVar93._8_4_;
  auVar104._8_4_ = fVar235 * auVar97._8_4_;
  fVar236 = auVar93._12_4_;
  auVar104._12_4_ = fVar236 * auVar97._12_4_;
  fVar237 = auVar93._16_4_;
  auVar104._16_4_ = fVar237 * auVar97._16_4_;
  fVar208 = auVar93._20_4_;
  auVar104._20_4_ = fVar208 * auVar97._20_4_;
  fVar209 = auVar93._24_4_;
  auVar104._24_4_ = fVar209 * auVar97._24_4_;
  auVar104._28_4_ = 1;
  auVar91._4_4_ = auVar95._4_4_ * fVar139;
  auVar91._0_4_ = auVar95._0_4_ * fVar232;
  auVar91._8_4_ = auVar95._8_4_ * fVar235;
  auVar91._12_4_ = auVar95._12_4_ * fVar236;
  auVar91._16_4_ = auVar95._16_4_ * fVar237;
  auVar91._20_4_ = auVar95._20_4_ * fVar208;
  auVar91._24_4_ = auVar95._24_4_ * fVar209;
  auVar91._28_4_ = auVar97._28_4_;
  auVar95._4_4_ = auVar102._4_4_ * fVar139;
  auVar95._0_4_ = auVar102._0_4_ * fVar232;
  auVar95._8_4_ = auVar102._8_4_ * fVar235;
  auVar95._12_4_ = auVar102._12_4_ * fVar236;
  auVar95._16_4_ = auVar102._16_4_ * fVar237;
  auVar95._20_4_ = auVar102._20_4_ * fVar208;
  auVar95._24_4_ = auVar102._24_4_ * fVar209;
  auVar95._28_4_ = auVar93._28_4_;
  auVar89 = vfmadd231ps_fma(auVar104,auVar103,auVar94);
  auVar81 = vfmadd231ps_fma(auVar91,auVar103,auVar99);
  auVar212 = vfmadd231ps_fma(auVar95,auVar103,auVar101);
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar114,auVar96);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar114,auVar98);
  auVar110._8_4_ = 0x7fffffff;
  auVar110._0_8_ = 0x7fffffff7fffffff;
  auVar110._12_4_ = 0x7fffffff;
  auVar110._16_4_ = 0x7fffffff;
  auVar110._20_4_ = 0x7fffffff;
  auVar110._24_4_ = 0x7fffffff;
  auVar110._28_4_ = 0x7fffffff;
  auVar212 = vfmadd231ps_fma(ZEXT1632(auVar212),auVar114,auVar100);
  auVar96 = vandps_avx(ZEXT1632(auVar83),auVar110);
  auVar112._8_4_ = 0x219392ef;
  auVar112._0_8_ = 0x219392ef219392ef;
  auVar112._12_4_ = 0x219392ef;
  auVar112._16_4_ = 0x219392ef;
  auVar112._20_4_ = 0x219392ef;
  auVar112._24_4_ = 0x219392ef;
  auVar112._28_4_ = 0x219392ef;
  uVar69 = vcmpps_avx512vl(auVar96,auVar112,1);
  bVar77 = (bool)((byte)uVar69 & 1);
  auVar92._0_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar83._0_4_;
  bVar77 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar83._4_4_;
  bVar77 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar83._8_4_;
  bVar77 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar83._12_4_;
  auVar92._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * 0x219392ef;
  auVar92._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * 0x219392ef;
  auVar92._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * 0x219392ef;
  auVar92._28_4_ = (uint)(byte)(uVar69 >> 7) * 0x219392ef;
  auVar96 = vandps_avx(ZEXT1632(auVar84),auVar110);
  uVar69 = vcmpps_avx512vl(auVar96,auVar112,1);
  bVar77 = (bool)((byte)uVar69 & 1);
  auVar106._0_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar84._0_4_;
  bVar77 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar106._4_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar84._4_4_;
  bVar77 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar106._8_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar84._8_4_;
  bVar77 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar106._12_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar84._12_4_;
  auVar106._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * 0x219392ef;
  auVar106._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * 0x219392ef;
  auVar106._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * 0x219392ef;
  auVar106._28_4_ = (uint)(byte)(uVar69 >> 7) * 0x219392ef;
  auVar96 = vandps_avx(ZEXT1632(auVar85),auVar110);
  uVar69 = vcmpps_avx512vl(auVar96,auVar112,1);
  bVar77 = (bool)((byte)uVar69 & 1);
  auVar96._0_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar85._0_4_;
  bVar77 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar85._4_4_;
  bVar77 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar85._8_4_;
  bVar77 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar85._12_4_;
  auVar96._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * 0x219392ef;
  auVar96._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * 0x219392ef;
  auVar96._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * 0x219392ef;
  auVar96._28_4_ = (uint)(byte)(uVar69 >> 7) * 0x219392ef;
  auVar94 = vrcp14ps_avx512vl(auVar92);
  auVar111._8_4_ = 0x3f800000;
  auVar111._0_8_ = 0x3f8000003f800000;
  auVar111._12_4_ = 0x3f800000;
  auVar111._16_4_ = 0x3f800000;
  auVar111._20_4_ = 0x3f800000;
  auVar111._24_4_ = 0x3f800000;
  auVar111._28_4_ = 0x3f800000;
  auVar83 = vfnmadd213ps_fma(auVar92,auVar94,auVar111);
  auVar83 = vfmadd132ps_fma(ZEXT1632(auVar83),auVar94,auVar94);
  auVar94 = vrcp14ps_avx512vl(auVar106);
  auVar84 = vfnmadd213ps_fma(auVar106,auVar94,auVar111);
  auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar94,auVar94);
  auVar94 = vrcp14ps_avx512vl(auVar96);
  auVar85 = vfnmadd213ps_fma(auVar96,auVar94,auVar111);
  auVar85 = vfmadd132ps_fma(ZEXT1632(auVar85),auVar94,auVar94);
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 7 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar89));
  auVar100._4_4_ = auVar83._4_4_ * auVar96._4_4_;
  auVar100._0_4_ = auVar83._0_4_ * auVar96._0_4_;
  auVar100._8_4_ = auVar83._8_4_ * auVar96._8_4_;
  auVar100._12_4_ = auVar83._12_4_ * auVar96._12_4_;
  auVar100._16_4_ = auVar96._16_4_ * 0.0;
  auVar100._20_4_ = auVar96._20_4_ * 0.0;
  auVar100._24_4_ = auVar96._24_4_ * 0.0;
  auVar100._28_4_ = auVar96._28_4_;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 9 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar89));
  auVar95 = vpbroadcastd_avx512vl();
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar1 * 0x10 + 6));
  auVar109._0_4_ = auVar83._0_4_ * auVar96._0_4_;
  auVar109._4_4_ = auVar83._4_4_ * auVar96._4_4_;
  auVar109._8_4_ = auVar83._8_4_ * auVar96._8_4_;
  auVar109._12_4_ = auVar83._12_4_ * auVar96._12_4_;
  auVar109._16_4_ = auVar96._16_4_ * 0.0;
  auVar109._20_4_ = auVar96._20_4_ * 0.0;
  auVar109._24_4_ = auVar96._24_4_ * 0.0;
  auVar109._28_4_ = 0;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar1 * 0x10 + uVar79 * -2 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar81));
  auVar101._4_4_ = auVar84._4_4_ * auVar96._4_4_;
  auVar101._0_4_ = auVar84._0_4_ * auVar96._0_4_;
  auVar101._8_4_ = auVar84._8_4_ * auVar96._8_4_;
  auVar101._12_4_ = auVar84._12_4_ * auVar96._12_4_;
  auVar101._16_4_ = auVar96._16_4_ * 0.0;
  auVar101._20_4_ = auVar96._20_4_ * 0.0;
  auVar101._24_4_ = auVar96._24_4_ * 0.0;
  auVar101._28_4_ = auVar96._28_4_;
  auVar96 = vcvtdq2ps_avx(auVar94);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar81));
  auVar108._0_4_ = auVar84._0_4_ * auVar96._0_4_;
  auVar108._4_4_ = auVar84._4_4_ * auVar96._4_4_;
  auVar108._8_4_ = auVar84._8_4_ * auVar96._8_4_;
  auVar108._12_4_ = auVar84._12_4_ * auVar96._12_4_;
  auVar108._16_4_ = auVar96._16_4_ * 0.0;
  auVar108._20_4_ = auVar96._20_4_ * 0.0;
  auVar108._24_4_ = auVar96._24_4_ * 0.0;
  auVar108._28_4_ = 0;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 + uVar79 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar212));
  auVar102._4_4_ = auVar96._4_4_ * auVar85._4_4_;
  auVar102._0_4_ = auVar96._0_4_ * auVar85._0_4_;
  auVar102._8_4_ = auVar96._8_4_ * auVar85._8_4_;
  auVar102._12_4_ = auVar96._12_4_ * auVar85._12_4_;
  auVar102._16_4_ = auVar96._16_4_ * 0.0;
  auVar102._20_4_ = auVar96._20_4_ * 0.0;
  auVar102._24_4_ = auVar96._24_4_ * 0.0;
  auVar102._28_4_ = auVar96._28_4_;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 0x17 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar212));
  auVar107._0_4_ = auVar85._0_4_ * auVar96._0_4_;
  auVar107._4_4_ = auVar85._4_4_ * auVar96._4_4_;
  auVar107._8_4_ = auVar85._8_4_ * auVar96._8_4_;
  auVar107._12_4_ = auVar85._12_4_ * auVar96._12_4_;
  auVar107._16_4_ = auVar96._16_4_ * 0.0;
  auVar107._20_4_ = auVar96._20_4_ * 0.0;
  auVar107._24_4_ = auVar96._24_4_ * 0.0;
  auVar107._28_4_ = 0;
  auVar96 = vpminsd_avx2(auVar100,auVar109);
  auVar94 = vpminsd_avx2(auVar101,auVar108);
  auVar96 = vmaxps_avx(auVar96,auVar94);
  auVar94 = vpminsd_avx2(auVar102,auVar107);
  uVar160 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar97._4_4_ = uVar160;
  auVar97._0_4_ = uVar160;
  auVar97._8_4_ = uVar160;
  auVar97._12_4_ = uVar160;
  auVar97._16_4_ = uVar160;
  auVar97._20_4_ = uVar160;
  auVar97._24_4_ = uVar160;
  auVar97._28_4_ = uVar160;
  auVar94 = vmaxps_avx512vl(auVar94,auVar97);
  auVar96 = vmaxps_avx(auVar96,auVar94);
  auVar94._8_4_ = 0x3f7ffffa;
  auVar94._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar94._12_4_ = 0x3f7ffffa;
  auVar94._16_4_ = 0x3f7ffffa;
  auVar94._20_4_ = 0x3f7ffffa;
  auVar94._24_4_ = 0x3f7ffffa;
  auVar94._28_4_ = 0x3f7ffffa;
  local_2e0 = vmulps_avx512vl(auVar96,auVar94);
  auVar96 = vpmaxsd_avx2(auVar100,auVar109);
  auVar94 = vpmaxsd_avx2(auVar101,auVar108);
  auVar96 = vminps_avx(auVar96,auVar94);
  auVar94 = vpmaxsd_avx2(auVar102,auVar107);
  uVar160 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar98._4_4_ = uVar160;
  auVar98._0_4_ = uVar160;
  auVar98._8_4_ = uVar160;
  auVar98._12_4_ = uVar160;
  auVar98._16_4_ = uVar160;
  auVar98._20_4_ = uVar160;
  auVar98._24_4_ = uVar160;
  auVar98._28_4_ = uVar160;
  auVar94 = vminps_avx512vl(auVar94,auVar98);
  auVar96 = vminps_avx(auVar96,auVar94);
  auVar99._8_4_ = 0x3f800003;
  auVar99._0_8_ = 0x3f8000033f800003;
  auVar99._12_4_ = 0x3f800003;
  auVar99._16_4_ = 0x3f800003;
  auVar99._20_4_ = 0x3f800003;
  auVar99._24_4_ = 0x3f800003;
  auVar99._28_4_ = 0x3f800003;
  auVar96 = vmulps_avx512vl(auVar96,auVar99);
  uVar13 = vpcmpgtd_avx512vl(auVar95,_DAT_01fe9900);
  uVar11 = vcmpps_avx512vl(local_2e0,auVar96,2);
  if ((byte)((byte)uVar11 & (byte)uVar13) == 0) {
    return false;
  }
  local_5a8 = (ulong)(byte)((byte)uVar11 & (byte)uVar13);
  pPVar75 = prim + lVar70 + 0x16;
  local_510 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_5b8 = pPVar75;
  local_5b0 = prim;
LAB_01ca6b4d:
  iVar15 = 0;
  for (uVar69 = local_5a8; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
    iVar15 = iVar15 + 1;
  }
  local_5a8 = local_5a8 - 1 & local_5a8;
  uVar69 = (ulong)(uint)(iVar15 << 6);
  auVar83 = *(undefined1 (*) [16])(pPVar75 + uVar69);
  if (local_5a8 != 0) {
    uVar72 = local_5a8 - 1 & local_5a8;
    for (uVar79 = local_5a8; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
    }
    if (uVar72 != 0) {
      for (; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar84 = *(undefined1 (*) [16])(pPVar75 + uVar69 + 0x10);
  auVar85 = *(undefined1 (*) [16])(pPVar75 + uVar69 + 0x20);
  auVar89 = *(undefined1 (*) [16])(pPVar75 + uVar69 + 0x30);
  auVar81 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar212 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_758 = (ulong)*(uint *)(prim + 2);
  uVar160 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar243._4_4_ = uVar160;
  auVar243._0_4_ = uVar160;
  auVar243._8_4_ = uVar160;
  auVar243._12_4_ = uVar160;
  local_400._16_4_ = uVar160;
  local_400._0_16_ = auVar243;
  local_400._20_4_ = uVar160;
  local_400._24_4_ = uVar160;
  local_400._28_4_ = uVar160;
  auVar247 = ZEXT3264(local_400);
  uVar160 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar248._4_4_ = uVar160;
  auVar248._0_4_ = uVar160;
  auVar248._8_4_ = uVar160;
  auVar248._12_4_ = uVar160;
  local_420._16_4_ = uVar160;
  local_420._0_16_ = auVar248;
  local_420._20_4_ = uVar160;
  local_420._24_4_ = uVar160;
  local_420._28_4_ = uVar160;
  auVar81 = vunpcklps_avx(auVar243,auVar248);
  fVar232 = *(float *)(ray + k * 4 + 0x60);
  auVar249._4_4_ = fVar232;
  auVar249._0_4_ = fVar232;
  auVar249._8_4_ = fVar232;
  auVar249._12_4_ = fVar232;
  local_440._16_4_ = fVar232;
  local_440._0_16_ = auVar249;
  local_440._20_4_ = fVar232;
  local_440._24_4_ = fVar232;
  local_440._28_4_ = fVar232;
  local_6b0 = vinsertps_avx(auVar81,auVar249,0x28);
  auVar238 = ZEXT1664(local_6b0);
  auVar223._0_4_ = auVar83._0_4_ + auVar84._0_4_ + auVar85._0_4_ + auVar89._0_4_;
  auVar223._4_4_ = auVar83._4_4_ + auVar84._4_4_ + auVar85._4_4_ + auVar89._4_4_;
  auVar223._8_4_ = auVar83._8_4_ + auVar84._8_4_ + auVar85._8_4_ + auVar89._8_4_;
  auVar223._12_4_ = auVar83._12_4_ + auVar84._12_4_ + auVar85._12_4_ + auVar89._12_4_;
  auVar87._8_4_ = 0x3e800000;
  auVar87._0_8_ = 0x3e8000003e800000;
  auVar87._12_4_ = 0x3e800000;
  auVar81 = vmulps_avx512vl(auVar223,auVar87);
  auVar81 = vsubps_avx(auVar81,auVar212);
  auVar81 = vdpps_avx(auVar81,local_6b0,0x7f);
  fVar139 = *(float *)(ray + k * 4 + 0x30);
  local_6c0 = vdpps_avx(local_6b0,local_6b0,0x7f);
  auVar242 = ZEXT1664(local_6c0);
  auVar227._4_12_ = ZEXT812(0) << 0x20;
  auVar227._0_4_ = local_6c0._0_4_;
  auVar82 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar227);
  auVar86 = vfnmadd213ss_fma(auVar82,local_6c0,ZEXT416(0x40000000));
  local_2c0 = auVar81._0_4_ * auVar82._0_4_ * auVar86._0_4_;
  auVar228._4_4_ = local_2c0;
  auVar228._0_4_ = local_2c0;
  auVar228._8_4_ = local_2c0;
  auVar228._12_4_ = local_2c0;
  fStack_9b0 = local_2c0;
  _local_9c0 = auVar228;
  fStack_9ac = local_2c0;
  fStack_9a8 = local_2c0;
  fStack_9a4 = local_2c0;
  auVar81 = vfmadd231ps_fma(auVar212,local_6b0,auVar228);
  auVar81 = vblendps_avx(auVar81,ZEXT816(0) << 0x40,8);
  auVar83 = vsubps_avx(auVar83,auVar81);
  auVar85 = vsubps_avx(auVar85,auVar81);
  auVar231 = ZEXT1664(auVar85);
  auVar84 = vsubps_avx(auVar84,auVar81);
  auVar234 = ZEXT1664(auVar84);
  auVar89 = vsubps_avx(auVar89,auVar81);
  local_8e0 = vbroadcastss_avx512vl(auVar83);
  auVar259 = ZEXT3264(local_8e0);
  auVar119._8_4_ = 1;
  auVar119._0_8_ = 0x100000001;
  auVar119._12_4_ = 1;
  auVar119._16_4_ = 1;
  auVar119._20_4_ = 1;
  auVar119._24_4_ = 1;
  auVar119._28_4_ = 1;
  local_640 = ZEXT1632(auVar83);
  local_900 = vpermps_avx512vl(auVar119,local_640);
  auVar251 = ZEXT3264(local_900);
  auVar120._8_4_ = 2;
  auVar120._0_8_ = 0x200000002;
  auVar120._12_4_ = 2;
  auVar120._16_4_ = 2;
  auVar120._20_4_ = 2;
  auVar120._24_4_ = 2;
  auVar120._28_4_ = 2;
  local_920 = vpermps_avx512vl(auVar120,local_640);
  auVar252 = ZEXT3264(local_920);
  auVar195._8_4_ = 3;
  auVar195._0_8_ = 0x300000003;
  auVar195._12_4_ = 3;
  auVar195._16_4_ = 3;
  auVar195._20_4_ = 3;
  auVar195._24_4_ = 3;
  auVar195._28_4_ = 3;
  local_940 = vpermps_avx512vl(auVar195,local_640);
  auVar253 = ZEXT3264(local_940);
  local_800 = vbroadcastss_avx512vl(auVar84);
  auVar254 = ZEXT3264(local_800);
  local_680 = ZEXT1632(auVar84);
  local_960 = vpermps_avx512vl(auVar119,local_680);
  auVar255 = ZEXT3264(local_960);
  local_820 = vpermps_avx512vl(auVar120,local_680);
  auVar256 = ZEXT3264(local_820);
  local_980 = vpermps_avx512vl(auVar195,local_680);
  auVar257 = ZEXT3264(local_980);
  local_840 = vbroadcastss_avx512vl(auVar85);
  auVar258 = ZEXT3264(local_840);
  local_660 = ZEXT1632(auVar85);
  local_860 = vpermps_avx512vl(auVar119,local_660);
  auVar260 = ZEXT3264(local_860);
  local_880 = vpermps_avx512vl(auVar120,local_660);
  auVar261 = ZEXT3264(local_880);
  local_8c0 = vpermps_avx512vl(auVar195,local_660);
  auVar262 = ZEXT3264(local_8c0);
  local_9a0 = vbroadcastss_avx512vl(auVar89);
  auVar263 = ZEXT3264(local_9a0);
  _local_6a0 = ZEXT1632(auVar89);
  local_260 = vpermps_avx512vl(auVar119,_local_6a0);
  local_240 = vpermps_avx512vl(auVar120,_local_6a0);
  local_2a0 = vpermps_avx2(auVar195,_local_6a0);
  auVar83 = vfmadd231ps_fma(ZEXT432((uint)(fVar232 * fVar232)),local_420,local_420);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),local_400,local_400);
  local_220._0_4_ = auVar83._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar116._8_4_ = 0x7fffffff;
  auVar116._0_8_ = 0x7fffffff7fffffff;
  auVar116._12_4_ = 0x7fffffff;
  auVar116._16_4_ = 0x7fffffff;
  auVar116._20_4_ = 0x7fffffff;
  auVar116._24_4_ = 0x7fffffff;
  auVar116._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar116);
  local_620 = ZEXT416((uint)local_2c0);
  local_2c0 = fVar139 - local_2c0;
  fStack_2bc = local_2c0;
  fStack_2b8 = local_2c0;
  fStack_2b4 = local_2c0;
  fStack_2b0 = local_2c0;
  fStack_2ac = local_2c0;
  fStack_2a8 = local_2c0;
  fStack_2a4 = local_2c0;
  local_4f0 = vpbroadcastd_avx512vl();
  local_9cc = 1;
  uVar69 = 0;
  bVar77 = false;
  local_500 = vpbroadcastd_avx512vl();
  auVar83 = vsqrtss_avx(local_6c0,local_6c0);
  local_9c4 = auVar83._0_4_;
  auVar83 = vsqrtss_avx(local_6c0,local_6c0);
  local_9c8 = auVar83._0_4_;
  local_390 = ZEXT816(0x3f80000000000000);
  auVar225 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 0x3f8000003f800000)
                                                                       ))))));
  local_280 = local_240;
  do {
    auVar83 = vmovshdup_avx(local_390);
    auVar83 = vsubps_avx(auVar83,local_390);
    local_8a0._0_4_ = auVar83._0_4_;
    fVar222 = local_8a0._0_4_ * 0.04761905;
    uVar160 = local_390._0_4_;
    auVar217._4_4_ = uVar160;
    auVar217._0_4_ = uVar160;
    auVar217._8_4_ = uVar160;
    auVar217._12_4_ = uVar160;
    auVar217._16_4_ = uVar160;
    auVar217._20_4_ = uVar160;
    auVar217._24_4_ = uVar160;
    auVar217._28_4_ = uVar160;
    local_8a0._4_4_ = local_8a0._0_4_;
    local_8a0._8_4_ = local_8a0._0_4_;
    local_8a0._12_4_ = local_8a0._0_4_;
    local_8a0._16_4_ = local_8a0._0_4_;
    local_8a0._20_4_ = local_8a0._0_4_;
    local_8a0._24_4_ = local_8a0._0_4_;
    local_8a0._28_4_ = local_8a0._0_4_;
    auVar83 = vfmadd231ps_fma(auVar217,local_8a0,_DAT_01faff20);
    auVar96 = vsubps_avx(auVar225._0_32_,ZEXT1632(auVar83));
    fVar232 = auVar96._0_4_;
    fVar236 = auVar96._4_4_;
    fVar208 = auVar96._8_4_;
    fVar210 = auVar96._12_4_;
    fVar211 = auVar96._16_4_;
    fVar220 = auVar96._20_4_;
    fVar221 = auVar96._24_4_;
    fVar140 = fVar232 * fVar232 * fVar232;
    fVar154 = fVar236 * fVar236 * fVar236;
    auVar34._4_4_ = fVar154;
    auVar34._0_4_ = fVar140;
    fVar155 = fVar208 * fVar208 * fVar208;
    auVar34._8_4_ = fVar155;
    fVar156 = fVar210 * fVar210 * fVar210;
    auVar34._12_4_ = fVar156;
    fVar157 = fVar211 * fVar211 * fVar211;
    auVar34._16_4_ = fVar157;
    fVar158 = fVar220 * fVar220 * fVar220;
    auVar34._20_4_ = fVar158;
    fVar159 = fVar221 * fVar221 * fVar221;
    auVar34._24_4_ = fVar159;
    auVar34._28_4_ = local_8a0._0_4_;
    auVar94 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar97 = vmulps_avx512vl(auVar34,auVar94);
    fVar235 = auVar83._0_4_;
    fVar237 = auVar83._4_4_;
    fVar209 = auVar83._8_4_;
    fVar203 = auVar83._12_4_;
    fVar176 = fVar235 * fVar235 * fVar235;
    fVar200 = fVar237 * fVar237 * fVar237;
    fVar201 = fVar209 * fVar209 * fVar209;
    fVar202 = fVar203 * fVar203 * fVar203;
    auVar66._28_4_ = DAT_01faff20._28_4_;
    auVar66._0_28_ = ZEXT1628(CONCAT412(fVar202,CONCAT48(fVar201,CONCAT44(fVar200,fVar176))));
    auVar239._0_4_ = fVar235 * fVar232;
    auVar239._4_4_ = fVar237 * fVar236;
    auVar239._8_4_ = fVar209 * fVar208;
    auVar239._12_4_ = fVar203 * fVar210;
    auVar239._16_4_ = fVar211 * 0.0;
    auVar239._20_4_ = fVar220 * 0.0;
    auVar239._28_36_ = auVar238._28_36_;
    auVar239._24_4_ = fVar221 * 0.0;
    auVar98 = vmulps_avx512vl(auVar66,auVar94);
    fVar241 = auVar98._28_4_ + local_8a0._0_4_;
    fVar226 = fVar241 + auVar242._28_4_ + auVar225._28_4_;
    auVar35._4_4_ = fVar154 * 0.16666667;
    auVar35._0_4_ = fVar140 * 0.16666667;
    auVar35._8_4_ = fVar155 * 0.16666667;
    auVar35._12_4_ = fVar156 * 0.16666667;
    auVar35._16_4_ = fVar157 * 0.16666667;
    auVar35._20_4_ = fVar158 * 0.16666667;
    auVar35._24_4_ = fVar159 * 0.16666667;
    auVar35._28_4_ = fVar241;
    auVar36._4_4_ =
         (auVar239._4_4_ * fVar236 * 12.0 + auVar239._4_4_ * fVar237 * 6.0 + fVar200 + auVar97._4_4_
         ) * 0.16666667;
    auVar36._0_4_ =
         (auVar239._0_4_ * fVar232 * 12.0 + auVar239._0_4_ * fVar235 * 6.0 + fVar176 + auVar97._0_4_
         ) * 0.16666667;
    auVar36._8_4_ =
         (auVar239._8_4_ * fVar208 * 12.0 + auVar239._8_4_ * fVar209 * 6.0 + fVar201 + auVar97._8_4_
         ) * 0.16666667;
    auVar36._12_4_ =
         (auVar239._12_4_ * fVar210 * 12.0 + auVar239._12_4_ * fVar203 * 6.0 +
         fVar202 + auVar97._12_4_) * 0.16666667;
    auVar36._16_4_ =
         (auVar239._16_4_ * fVar211 * 12.0 + auVar239._16_4_ * 0.0 * 6.0 + auVar97._16_4_ + 0.0) *
         0.16666667;
    auVar36._20_4_ =
         (auVar239._20_4_ * fVar220 * 12.0 + auVar239._20_4_ * 0.0 * 6.0 + auVar97._20_4_ + 0.0) *
         0.16666667;
    auVar36._24_4_ =
         (auVar239._24_4_ * fVar221 * 12.0 + auVar239._24_4_ * 0.0 * 6.0 + auVar97._24_4_ + 0.0) *
         0.16666667;
    auVar36._28_4_ = auVar242._28_4_;
    auVar37._4_4_ =
         (auVar98._4_4_ + fVar154 + auVar239._4_4_ * fVar237 * 12.0 + auVar239._4_4_ * fVar236 * 6.0
         ) * 0.16666667;
    auVar37._0_4_ =
         (auVar98._0_4_ + fVar140 + auVar239._0_4_ * fVar235 * 12.0 + auVar239._0_4_ * fVar232 * 6.0
         ) * 0.16666667;
    auVar37._8_4_ =
         (auVar98._8_4_ + fVar155 + auVar239._8_4_ * fVar209 * 12.0 + auVar239._8_4_ * fVar208 * 6.0
         ) * 0.16666667;
    auVar37._12_4_ =
         (auVar98._12_4_ + fVar156 +
         auVar239._12_4_ * fVar203 * 12.0 + auVar239._12_4_ * fVar210 * 6.0) * 0.16666667;
    auVar37._16_4_ =
         (auVar98._16_4_ + fVar157 + auVar239._16_4_ * 0.0 * 12.0 + auVar239._16_4_ * fVar211 * 6.0)
         * 0.16666667;
    auVar37._20_4_ =
         (auVar98._20_4_ + fVar158 + auVar239._20_4_ * 0.0 * 12.0 + auVar239._20_4_ * fVar220 * 6.0)
         * 0.16666667;
    auVar37._24_4_ =
         (auVar98._24_4_ + fVar159 + auVar239._24_4_ * 0.0 * 12.0 + auVar239._24_4_ * fVar221 * 6.0)
         * 0.16666667;
    auVar37._28_4_ = auVar247._28_4_;
    auVar38._28_4_ = fVar226;
    auVar38._0_28_ =
         ZEXT1628(CONCAT412(fVar202 * 0.16666667,
                            CONCAT48(fVar201 * 0.16666667,
                                     CONCAT44(fVar200 * 0.16666667,fVar176 * 0.16666667))));
    auVar97 = vmulps_avx512vl(auVar263._0_32_,auVar38);
    auVar98 = vmulps_avx512vl(local_260,auVar38);
    auVar99 = vmulps_avx512vl(local_280,auVar38);
    auVar39._4_4_ = local_2a0._4_4_ * fVar200 * 0.16666667;
    auVar39._0_4_ = local_2a0._0_4_ * fVar176 * 0.16666667;
    auVar39._8_4_ = local_2a0._8_4_ * fVar201 * 0.16666667;
    auVar39._12_4_ = local_2a0._12_4_ * fVar202 * 0.16666667;
    auVar39._16_4_ = local_2a0._16_4_ * 0.0;
    auVar39._20_4_ = local_2a0._20_4_ * 0.0;
    auVar39._24_4_ = local_2a0._24_4_ * 0.0;
    auVar39._28_4_ = fVar226;
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar37,auVar258._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar37,auVar260._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar37,auVar261._0_32_);
    auVar95 = vfmadd231ps_avx512vl(auVar39,auVar262._0_32_,auVar37);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar36,auVar254._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar36,auVar255._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar36,auVar256._0_32_);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar257._0_32_,auVar36);
    auVar100 = vfmadd231ps_avx512vl(auVar97,auVar35,auVar259._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar98,auVar35,auVar251._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar99,auVar35,auVar252._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar95,auVar253._0_32_,auVar35);
    auVar103 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar98 = vxorps_avx512vl(auVar96,auVar103);
    auVar99 = vxorps_avx512vl(ZEXT1632(auVar83),auVar103);
    auVar218._0_4_ = auVar99._0_4_ * fVar235;
    auVar218._4_4_ = auVar99._4_4_ * fVar237;
    auVar218._8_4_ = auVar99._8_4_ * fVar209;
    auVar218._12_4_ = auVar99._12_4_ * fVar203;
    auVar218._16_4_ = auVar99._16_4_ * 0.0;
    auVar218._20_4_ = auVar99._20_4_ * 0.0;
    auVar218._24_4_ = auVar99._24_4_ * 0.0;
    auVar218._28_4_ = 0;
    auVar99 = vmulps_avx512vl(auVar239._0_32_,auVar94);
    auVar94 = vsubps_avx(auVar218,auVar99);
    auVar40._4_4_ = auVar98._4_4_ * fVar236 * 0.5;
    auVar40._0_4_ = auVar98._0_4_ * fVar232 * 0.5;
    auVar40._8_4_ = auVar98._8_4_ * fVar208 * 0.5;
    auVar40._12_4_ = auVar98._12_4_ * fVar210 * 0.5;
    auVar40._16_4_ = auVar98._16_4_ * fVar211 * 0.5;
    auVar40._20_4_ = auVar98._20_4_ * fVar220 * 0.5;
    auVar40._24_4_ = auVar98._24_4_ * fVar221 * 0.5;
    auVar40._28_4_ = auVar96._28_4_;
    auVar41._4_4_ = auVar94._4_4_ * 0.5;
    auVar41._0_4_ = auVar94._0_4_ * 0.5;
    auVar41._8_4_ = auVar94._8_4_ * 0.5;
    auVar41._12_4_ = auVar94._12_4_ * 0.5;
    auVar41._16_4_ = auVar94._16_4_ * 0.5;
    auVar41._20_4_ = auVar94._20_4_ * 0.5;
    auVar41._24_4_ = auVar94._24_4_ * 0.5;
    auVar41._28_4_ = auVar94._28_4_;
    auVar42._4_4_ = (auVar99._4_4_ + fVar236 * fVar236) * 0.5;
    auVar42._0_4_ = (auVar99._0_4_ + fVar232 * fVar232) * 0.5;
    auVar42._8_4_ = (auVar99._8_4_ + fVar208 * fVar208) * 0.5;
    auVar42._12_4_ = (auVar99._12_4_ + fVar210 * fVar210) * 0.5;
    auVar42._16_4_ = (auVar99._16_4_ + fVar211 * fVar211) * 0.5;
    auVar42._20_4_ = (auVar99._20_4_ + fVar220 * fVar220) * 0.5;
    auVar42._24_4_ = (auVar99._24_4_ + fVar221 * fVar221) * 0.5;
    auVar42._28_4_ = auVar99._28_4_ + auVar231._28_4_;
    fVar232 = fVar235 * fVar235 * 0.5;
    fVar235 = fVar237 * fVar237 * 0.5;
    fVar236 = fVar209 * fVar209 * 0.5;
    fVar237 = fVar203 * fVar203 * 0.5;
    auVar43._28_4_ = auVar234._28_4_;
    auVar43._0_28_ = ZEXT1628(CONCAT412(fVar237,CONCAT48(fVar236,CONCAT44(fVar235,fVar232))));
    auVar44._4_4_ = auVar263._4_4_ * fVar235;
    auVar44._0_4_ = auVar263._0_4_ * fVar232;
    auVar44._8_4_ = auVar263._8_4_ * fVar236;
    auVar44._12_4_ = auVar263._12_4_ * fVar237;
    auVar44._16_4_ = auVar263._16_4_ * 0.0;
    auVar44._20_4_ = auVar263._20_4_ * 0.0;
    auVar44._24_4_ = auVar263._24_4_ * 0.0;
    auVar44._28_4_ = 0x3f000000;
    auVar96 = vmulps_avx512vl(local_260,auVar43);
    auVar94 = vmulps_avx512vl(local_280,auVar43);
    auVar45._4_4_ = local_2a0._4_4_ * fVar235;
    auVar45._0_4_ = local_2a0._0_4_ * fVar232;
    auVar45._8_4_ = local_2a0._8_4_ * fVar236;
    auVar45._12_4_ = local_2a0._12_4_ * fVar237;
    auVar45._16_4_ = local_2a0._16_4_ * 0.0;
    auVar45._20_4_ = local_2a0._20_4_ * 0.0;
    auVar45._24_4_ = local_2a0._24_4_ * 0.0;
    auVar45._28_4_ = auVar234._28_4_;
    auVar98 = vfmadd231ps_avx512vl(auVar44,auVar42,auVar258._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar42,auVar260._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar42,auVar261._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar45,auVar262._0_32_,auVar42);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar41,auVar254._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar41,auVar255._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar41,auVar256._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar257._0_32_,auVar41);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar40,auVar259._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar40,auVar251._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar40,auVar252._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar253._0_32_,auVar40);
    auVar46._4_4_ = auVar98._4_4_ * fVar222;
    auVar46._0_4_ = auVar98._0_4_ * fVar222;
    auVar46._8_4_ = auVar98._8_4_ * fVar222;
    auVar46._12_4_ = auVar98._12_4_ * fVar222;
    auVar46._16_4_ = auVar98._16_4_ * fVar222;
    auVar46._20_4_ = auVar98._20_4_ * fVar222;
    auVar46._24_4_ = auVar98._24_4_ * fVar222;
    auVar46._28_4_ = auVar247._28_4_;
    auVar247 = ZEXT3264(auVar46);
    auVar47._4_4_ = auVar96._4_4_ * fVar222;
    auVar47._0_4_ = auVar96._0_4_ * fVar222;
    auVar47._8_4_ = auVar96._8_4_ * fVar222;
    auVar47._12_4_ = auVar96._12_4_ * fVar222;
    auVar47._16_4_ = auVar96._16_4_ * fVar222;
    auVar47._20_4_ = auVar96._20_4_ * fVar222;
    auVar47._24_4_ = auVar96._24_4_ * fVar222;
    auVar47._28_4_ = 0x3e2aaaab;
    auVar48._4_4_ = auVar94._4_4_ * fVar222;
    auVar48._0_4_ = auVar94._0_4_ * fVar222;
    auVar48._8_4_ = auVar94._8_4_ * fVar222;
    auVar48._12_4_ = auVar94._12_4_ * fVar222;
    auVar48._16_4_ = auVar94._16_4_ * fVar222;
    auVar48._20_4_ = auVar94._20_4_ * fVar222;
    auVar48._24_4_ = auVar94._24_4_ * fVar222;
    auVar48._28_4_ = 0x40c00000;
    fVar232 = auVar99._0_4_ * fVar222;
    fVar235 = auVar99._4_4_ * fVar222;
    auVar49._4_4_ = fVar235;
    auVar49._0_4_ = fVar232;
    fVar236 = auVar99._8_4_ * fVar222;
    auVar49._8_4_ = fVar236;
    fVar237 = auVar99._12_4_ * fVar222;
    auVar49._12_4_ = fVar237;
    fVar208 = auVar99._16_4_ * fVar222;
    auVar49._16_4_ = fVar208;
    fVar209 = auVar99._20_4_ * fVar222;
    auVar49._20_4_ = fVar209;
    fVar210 = auVar99._24_4_ * fVar222;
    auVar49._24_4_ = fVar210;
    auVar49._28_4_ = fVar222;
    auVar83 = vxorps_avx512vl(auVar262._0_16_,auVar262._0_16_);
    auVar93 = vpermt2ps_avx512vl(auVar100,_DAT_01feed00,ZEXT1632(auVar83));
    auVar238 = ZEXT3264(auVar93);
    auVar104 = vpermt2ps_avx512vl(auVar101,_DAT_01feed00,ZEXT1632(auVar83));
    auVar98 = ZEXT1632(auVar83);
    auVar105 = vpermt2ps_avx512vl(auVar102,_DAT_01feed00,auVar98);
    auVar242 = ZEXT3264(auVar105);
    auVar219._0_4_ = fVar232 + auVar97._0_4_;
    auVar219._4_4_ = fVar235 + auVar97._4_4_;
    auVar219._8_4_ = fVar236 + auVar97._8_4_;
    auVar219._12_4_ = fVar237 + auVar97._12_4_;
    auVar219._16_4_ = fVar208 + auVar97._16_4_;
    auVar219._20_4_ = fVar209 + auVar97._20_4_;
    auVar219._24_4_ = fVar210 + auVar97._24_4_;
    auVar219._28_4_ = fVar222 + auVar97._28_4_;
    auVar96 = vmaxps_avx(auVar97,auVar219);
    auVar94 = vminps_avx(auVar97,auVar219);
    auVar91 = vpermt2ps_avx512vl(auVar97,_DAT_01feed00,auVar98);
    auVar92 = vpermt2ps_avx512vl(auVar46,_DAT_01feed00,auVar98);
    auVar234 = ZEXT3264(auVar92);
    auVar106 = vpermt2ps_avx512vl(auVar47,_DAT_01feed00,auVar98);
    auVar119 = ZEXT1632(auVar83);
    auVar107 = vpermt2ps_avx512vl(auVar48,_DAT_01feed00,auVar119);
    auVar97 = vpermt2ps_avx512vl(auVar49,_DAT_01feed00,auVar119);
    auVar108 = vsubps_avx512vl(auVar91,auVar97);
    auVar97 = vsubps_avx(auVar93,auVar100);
    auVar231 = ZEXT3264(auVar97);
    auVar98 = vsubps_avx(auVar104,auVar101);
    auVar99 = vsubps_avx(auVar105,auVar102);
    auVar95 = vmulps_avx512vl(auVar98,auVar48);
    auVar95 = vfmsub231ps_avx512vl(auVar95,auVar47,auVar99);
    auVar109 = vmulps_avx512vl(auVar99,auVar46);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar48,auVar97);
    auVar110 = vmulps_avx512vl(auVar97,auVar47);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar46,auVar98);
    auVar110 = vmulps_avx512vl(auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar95,auVar95);
    auVar95 = vmulps_avx512vl(auVar99,auVar99);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar98,auVar98);
    auVar110 = vfmadd231ps_avx512vl(auVar95,auVar97,auVar97);
    auVar111 = vrcp14ps_avx512vl(auVar110);
    auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar112 = vfnmadd213ps_avx512vl(auVar111,auVar110,auVar95);
    auVar111 = vfmadd132ps_avx512vl(auVar112,auVar111,auVar111);
    auVar109 = vmulps_avx512vl(auVar109,auVar111);
    auVar112 = vmulps_avx512vl(auVar98,auVar107);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar106,auVar99);
    auVar113 = vmulps_avx512vl(auVar99,auVar92);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar107,auVar97);
    auVar114 = vmulps_avx512vl(auVar97,auVar106);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar92,auVar98);
    auVar114 = vmulps_avx512vl(auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar112);
    auVar111 = vmulps_avx512vl(auVar112,auVar111);
    auVar109 = vmaxps_avx512vl(auVar109,auVar111);
    auVar109 = vsqrtps_avx512vl(auVar109);
    auVar111 = vmaxps_avx512vl(auVar108,auVar91);
    auVar96 = vmaxps_avx512vl(auVar96,auVar111);
    auVar111 = vaddps_avx512vl(auVar109,auVar96);
    auVar96 = vminps_avx512vl(auVar108,auVar91);
    auVar96 = vminps_avx(auVar94,auVar96);
    auVar96 = vsubps_avx512vl(auVar96,auVar109);
    auVar22._8_4_ = 0x3f800002;
    auVar22._0_8_ = 0x3f8000023f800002;
    auVar22._12_4_ = 0x3f800002;
    auVar22._16_4_ = 0x3f800002;
    auVar22._20_4_ = 0x3f800002;
    auVar22._24_4_ = 0x3f800002;
    auVar22._28_4_ = 0x3f800002;
    auVar94 = vmulps_avx512vl(auVar111,auVar22);
    auVar23._8_4_ = 0x3f7ffffc;
    auVar23._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar23._12_4_ = 0x3f7ffffc;
    auVar23._16_4_ = 0x3f7ffffc;
    auVar23._20_4_ = 0x3f7ffffc;
    auVar23._24_4_ = 0x3f7ffffc;
    auVar23._28_4_ = 0x3f7ffffc;
    local_6e0 = vmulps_avx512vl(auVar96,auVar23);
    auVar96 = vmulps_avx512vl(auVar94,auVar94);
    auVar94 = vrsqrt14ps_avx512vl(auVar110);
    auVar24._8_4_ = 0xbf000000;
    auVar24._0_8_ = 0xbf000000bf000000;
    auVar24._12_4_ = 0xbf000000;
    auVar24._16_4_ = 0xbf000000;
    auVar24._20_4_ = 0xbf000000;
    auVar24._24_4_ = 0xbf000000;
    auVar24._28_4_ = 0xbf000000;
    auVar91 = vmulps_avx512vl(auVar110,auVar24);
    fVar232 = auVar94._0_4_;
    fVar235 = auVar94._4_4_;
    fVar236 = auVar94._8_4_;
    fVar237 = auVar94._12_4_;
    fVar208 = auVar94._16_4_;
    fVar209 = auVar94._20_4_;
    fVar210 = auVar94._24_4_;
    auVar50._4_4_ = fVar235 * fVar235 * fVar235 * auVar91._4_4_;
    auVar50._0_4_ = fVar232 * fVar232 * fVar232 * auVar91._0_4_;
    auVar50._8_4_ = fVar236 * fVar236 * fVar236 * auVar91._8_4_;
    auVar50._12_4_ = fVar237 * fVar237 * fVar237 * auVar91._12_4_;
    auVar50._16_4_ = fVar208 * fVar208 * fVar208 * auVar91._16_4_;
    auVar50._20_4_ = fVar209 * fVar209 * fVar209 * auVar91._20_4_;
    auVar50._24_4_ = fVar210 * fVar210 * fVar210 * auVar91._24_4_;
    auVar50._28_4_ = auVar111._28_4_;
    auVar25._8_4_ = 0x3fc00000;
    auVar25._0_8_ = 0x3fc000003fc00000;
    auVar25._12_4_ = 0x3fc00000;
    auVar25._16_4_ = 0x3fc00000;
    auVar25._20_4_ = 0x3fc00000;
    auVar25._24_4_ = 0x3fc00000;
    auVar25._28_4_ = 0x3fc00000;
    auVar94 = vfmadd231ps_avx512vl(auVar50,auVar94,auVar25);
    auVar91 = vmulps_avx512vl(auVar97,auVar94);
    auVar108 = vmulps_avx512vl(auVar98,auVar94);
    auVar109 = vmulps_avx512vl(auVar99,auVar94);
    auVar110 = vsubps_avx512vl(auVar119,auVar100);
    auVar111 = vsubps_avx512vl(auVar119,auVar101);
    auVar112 = vsubps_avx512vl(auVar119,auVar102);
    auVar113 = vmulps_avx512vl(local_440,auVar112);
    auVar113 = vfmadd231ps_avx512vl(auVar113,local_420,auVar111);
    auVar113 = vfmadd231ps_avx512vl(auVar113,local_400,auVar110);
    auVar114 = vmulps_avx512vl(auVar112,auVar112);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar111,auVar111);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar110,auVar110);
    auVar115 = vmulps_avx512vl(local_440,auVar109);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar108,local_420);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar91,local_400);
    auVar109 = vmulps_avx512vl(auVar112,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar111,auVar108);
    auVar91 = vfmadd231ps_avx512vl(auVar108,auVar110,auVar91);
    auVar108 = vmulps_avx512vl(auVar115,auVar115);
    auVar109 = vsubps_avx512vl(local_220,auVar108);
    auVar116 = vmulps_avx512vl(auVar115,auVar91);
    auVar113 = vsubps_avx512vl(auVar113,auVar116);
    auVar113 = vaddps_avx512vl(auVar113,auVar113);
    auVar116 = vmulps_avx512vl(auVar91,auVar91);
    local_700 = vsubps_avx512vl(auVar114,auVar116);
    auVar96 = vsubps_avx512vl(local_700,auVar96);
    local_7a0 = vmulps_avx512vl(auVar113,auVar113);
    auVar26._8_4_ = 0x40800000;
    auVar26._0_8_ = 0x4080000040800000;
    auVar26._12_4_ = 0x40800000;
    auVar26._16_4_ = 0x40800000;
    auVar26._20_4_ = 0x40800000;
    auVar26._24_4_ = 0x40800000;
    auVar26._28_4_ = 0x40800000;
    _local_7c0 = vmulps_avx512vl(auVar109,auVar26);
    auVar114 = vmulps_avx512vl(_local_7c0,auVar96);
    auVar114 = vsubps_avx512vl(local_7a0,auVar114);
    uVar79 = vcmpps_avx512vl(auVar114,auVar119,5);
    bVar67 = (byte)uVar79;
    fVar232 = (float)local_9c0._0_4_;
    fVar235 = (float)local_9c0._4_4_;
    fVar236 = fStack_9b8;
    fVar237 = fStack_9b4;
    fVar208 = fStack_9b0;
    fVar209 = fStack_9ac;
    fVar210 = fStack_9a8;
    fVar203 = fStack_9a4;
    if (bVar67 == 0) {
LAB_01ca7896:
      auVar225 = ZEXT3264(auVar95);
      auVar259 = ZEXT3264(local_8e0);
      auVar251 = ZEXT3264(local_900);
      auVar252 = ZEXT3264(local_920);
      auVar253 = ZEXT3264(local_940);
      auVar254 = ZEXT3264(local_800);
      auVar255 = ZEXT3264(local_960);
      auVar256 = ZEXT3264(local_820);
      auVar257 = ZEXT3264(local_980);
      auVar258 = ZEXT3264(local_840);
      auVar260 = ZEXT3264(local_860);
      auVar261 = ZEXT3264(local_880);
      auVar262 = ZEXT3264(local_8c0);
      auVar263 = ZEXT3264(local_9a0);
    }
    else {
      auVar114 = vsqrtps_avx512vl(auVar114);
      auVar116 = vaddps_avx512vl(auVar109,auVar109);
      local_7e0 = vrcp14ps_avx512vl(auVar116);
      auVar95 = vfnmadd213ps_avx512vl(local_7e0,auVar116,auVar95);
      auVar95 = vfmadd132ps_avx512vl(auVar95,local_7e0,local_7e0);
      _local_560 = vxorps_avx512vl(auVar113,auVar103);
      auVar103 = vsubps_avx512vl(_local_560,auVar114);
      auVar103 = vmulps_avx512vl(auVar103,auVar95);
      auVar114 = vsubps_avx512vl(auVar114,auVar113);
      local_540 = vmulps_avx512vl(auVar114,auVar95);
      auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar114 = vblendmps_avx512vl(auVar95,auVar103);
      auVar117._0_4_ =
           (uint)(bVar67 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar95._0_4_;
      bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar117._4_4_ = (uint)bVar78 * auVar114._4_4_ | (uint)!bVar78 * auVar95._4_4_;
      bVar78 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar117._8_4_ = (uint)bVar78 * auVar114._8_4_ | (uint)!bVar78 * auVar95._8_4_;
      bVar78 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar117._12_4_ = (uint)bVar78 * auVar114._12_4_ | (uint)!bVar78 * auVar95._12_4_;
      bVar78 = (bool)((byte)(uVar79 >> 4) & 1);
      auVar117._16_4_ = (uint)bVar78 * auVar114._16_4_ | (uint)!bVar78 * auVar95._16_4_;
      bVar78 = (bool)((byte)(uVar79 >> 5) & 1);
      auVar117._20_4_ = (uint)bVar78 * auVar114._20_4_ | (uint)!bVar78 * auVar95._20_4_;
      bVar78 = (bool)((byte)(uVar79 >> 6) & 1);
      auVar117._24_4_ = (uint)bVar78 * auVar114._24_4_ | (uint)!bVar78 * auVar95._24_4_;
      bVar78 = SUB81(uVar79 >> 7,0);
      auVar117._28_4_ = (uint)bVar78 * auVar114._28_4_ | (uint)!bVar78 * auVar95._28_4_;
      auVar95 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar114 = vblendmps_avx512vl(auVar95,local_540);
      auVar118._0_4_ =
           (uint)(bVar67 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar95._0_4_;
      bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar118._4_4_ = (uint)bVar78 * auVar114._4_4_ | (uint)!bVar78 * auVar95._4_4_;
      bVar78 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar118._8_4_ = (uint)bVar78 * auVar114._8_4_ | (uint)!bVar78 * auVar95._8_4_;
      bVar78 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar118._12_4_ = (uint)bVar78 * auVar114._12_4_ | (uint)!bVar78 * auVar95._12_4_;
      bVar78 = (bool)((byte)(uVar79 >> 4) & 1);
      auVar118._16_4_ = (uint)bVar78 * auVar114._16_4_ | (uint)!bVar78 * auVar95._16_4_;
      bVar78 = (bool)((byte)(uVar79 >> 5) & 1);
      auVar118._20_4_ = (uint)bVar78 * auVar114._20_4_ | (uint)!bVar78 * auVar95._20_4_;
      bVar78 = (bool)((byte)(uVar79 >> 6) & 1);
      auVar118._24_4_ = (uint)bVar78 * auVar114._24_4_ | (uint)!bVar78 * auVar95._24_4_;
      bVar78 = SUB81(uVar79 >> 7,0);
      auVar118._28_4_ = (uint)bVar78 * auVar114._28_4_ | (uint)!bVar78 * auVar95._28_4_;
      auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar108,auVar95);
      local_580 = vmaxps_avx512vl(local_240,auVar95);
      auVar27._8_4_ = 0x36000000;
      auVar27._0_8_ = 0x3600000036000000;
      auVar27._12_4_ = 0x36000000;
      auVar27._16_4_ = 0x36000000;
      auVar27._20_4_ = 0x36000000;
      auVar27._24_4_ = 0x36000000;
      auVar27._28_4_ = 0x36000000;
      local_5a0 = vmulps_avx512vl(local_580,auVar27);
      vandps_avx512vl(auVar109,auVar95);
      uVar72 = vcmpps_avx512vl(local_5a0,local_5a0,1);
      uVar79 = uVar79 & uVar72;
      bVar71 = (byte)uVar79;
      if (bVar71 != 0) {
        uVar72 = vcmpps_avx512vl(auVar96,_DAT_01faff00,2);
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar95 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar108 = vblendmps_avx512vl(auVar96,auVar95);
        bVar73 = (byte)uVar72;
        uVar76 = (uint)(bVar73 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar73 & 1) * local_5a0._0_4_;
        bVar78 = (bool)((byte)(uVar72 >> 1) & 1);
        uVar80 = (uint)bVar78 * auVar108._4_4_ | (uint)!bVar78 * local_5a0._4_4_;
        bVar78 = (bool)((byte)(uVar72 >> 2) & 1);
        uVar132 = (uint)bVar78 * auVar108._8_4_ | (uint)!bVar78 * local_5a0._8_4_;
        bVar78 = (bool)((byte)(uVar72 >> 3) & 1);
        uVar133 = (uint)bVar78 * auVar108._12_4_ | (uint)!bVar78 * local_5a0._12_4_;
        bVar78 = (bool)((byte)(uVar72 >> 4) & 1);
        uVar134 = (uint)bVar78 * auVar108._16_4_ | (uint)!bVar78 * local_5a0._16_4_;
        bVar78 = (bool)((byte)(uVar72 >> 5) & 1);
        uVar135 = (uint)bVar78 * auVar108._20_4_ | (uint)!bVar78 * local_5a0._20_4_;
        bVar78 = (bool)((byte)(uVar72 >> 6) & 1);
        uVar136 = (uint)bVar78 * auVar108._24_4_ | (uint)!bVar78 * local_5a0._24_4_;
        bVar78 = SUB81(uVar72 >> 7,0);
        uVar137 = (uint)bVar78 * auVar108._28_4_ | (uint)!bVar78 * local_5a0._28_4_;
        auVar117._0_4_ = (bVar71 & 1) * uVar76 | !(bool)(bVar71 & 1) * auVar117._0_4_;
        bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar117._4_4_ = bVar78 * uVar80 | !bVar78 * auVar117._4_4_;
        bVar78 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar117._8_4_ = bVar78 * uVar132 | !bVar78 * auVar117._8_4_;
        bVar78 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar117._12_4_ = bVar78 * uVar133 | !bVar78 * auVar117._12_4_;
        bVar78 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar117._16_4_ = bVar78 * uVar134 | !bVar78 * auVar117._16_4_;
        bVar78 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar117._20_4_ = bVar78 * uVar135 | !bVar78 * auVar117._20_4_;
        bVar78 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar117._24_4_ = bVar78 * uVar136 | !bVar78 * auVar117._24_4_;
        bVar78 = SUB81(uVar79 >> 7,0);
        auVar117._28_4_ = bVar78 * uVar137 | !bVar78 * auVar117._28_4_;
        auVar96 = vblendmps_avx512vl(auVar95,auVar96);
        bVar78 = (bool)((byte)(uVar72 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar72 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar72 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar72 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar72 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar72 >> 6) & 1);
        bVar10 = SUB81(uVar72 >> 7,0);
        auVar118._0_4_ =
             (uint)(bVar71 & 1) *
             ((uint)(bVar73 & 1) * auVar96._0_4_ | !(bool)(bVar73 & 1) * uVar76) |
             !(bool)(bVar71 & 1) * auVar118._0_4_;
        bVar4 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar118._4_4_ =
             (uint)bVar4 * ((uint)bVar78 * auVar96._4_4_ | !bVar78 * uVar80) |
             !bVar4 * auVar118._4_4_;
        bVar78 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar118._8_4_ =
             (uint)bVar78 * ((uint)bVar5 * auVar96._8_4_ | !bVar5 * uVar132) |
             !bVar78 * auVar118._8_4_;
        bVar78 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar118._12_4_ =
             (uint)bVar78 * ((uint)bVar6 * auVar96._12_4_ | !bVar6 * uVar133) |
             !bVar78 * auVar118._12_4_;
        bVar78 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar118._16_4_ =
             (uint)bVar78 * ((uint)bVar7 * auVar96._16_4_ | !bVar7 * uVar134) |
             !bVar78 * auVar118._16_4_;
        bVar78 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar118._20_4_ =
             (uint)bVar78 * ((uint)bVar8 * auVar96._20_4_ | !bVar8 * uVar135) |
             !bVar78 * auVar118._20_4_;
        bVar78 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar118._24_4_ =
             (uint)bVar78 * ((uint)bVar9 * auVar96._24_4_ | !bVar9 * uVar136) |
             !bVar78 * auVar118._24_4_;
        bVar78 = SUB81(uVar79 >> 7,0);
        auVar118._28_4_ =
             (uint)bVar78 * ((uint)bVar10 * auVar96._28_4_ | !bVar10 * uVar137) |
             !bVar78 * auVar118._28_4_;
        bVar67 = (~bVar71 | bVar73) & bVar67;
      }
      auVar262 = ZEXT3264(local_8c0);
      if ((bVar67 & 0x7f) == 0) {
        auVar225 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar259 = ZEXT3264(local_8e0);
        auVar251 = ZEXT3264(local_900);
        auVar252 = ZEXT3264(local_920);
        auVar253 = ZEXT3264(local_940);
        auVar254 = ZEXT3264(local_800);
        auVar255 = ZEXT3264(local_960);
        auVar256 = ZEXT3264(local_820);
        auVar257 = ZEXT3264(local_980);
        auVar258 = ZEXT3264(local_840);
        auVar260 = ZEXT3264(local_860);
        auVar261 = ZEXT3264(local_880);
        auVar263 = ZEXT3264(local_9a0);
      }
      else {
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar107 = vxorps_avx512vl(auVar107,auVar96);
        auVar92 = vxorps_avx512vl(auVar92,auVar96);
        uVar76 = *(uint *)(ray + k * 4 + 0x80);
        auVar106 = vxorps_avx512vl(auVar106,auVar96);
        local_770 = ZEXT416(uVar76);
        auVar83 = vsubss_avx512f(local_770,ZEXT416((uint)local_620._0_4_));
        auVar95 = vbroadcastss_avx512vl(auVar83);
        auVar108 = vminps_avx512vl(auVar95,auVar118);
        auVar65._4_4_ = fStack_2bc;
        auVar65._0_4_ = local_2c0;
        auVar65._8_4_ = fStack_2b8;
        auVar65._12_4_ = fStack_2b4;
        auVar65._16_4_ = fStack_2b0;
        auVar65._20_4_ = fStack_2ac;
        auVar65._24_4_ = fStack_2a8;
        auVar65._28_4_ = fStack_2a4;
        auVar109 = vmaxps_avx512vl(auVar65,auVar117);
        auVar95 = vmulps_avx512vl(auVar48,auVar112);
        auVar95 = vfmadd213ps_avx512vl(auVar111,auVar47,auVar95);
        auVar83 = vfmadd213ps_fma(auVar110,auVar46,auVar95);
        auVar95 = vmulps_avx512vl(local_440,auVar48);
        auVar95 = vfmadd231ps_avx512vl(auVar95,local_420,auVar47);
        auVar84 = vfmadd231ps_fma(auVar95,local_400,auVar46);
        auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(ZEXT1632(auVar84),auVar110);
        auVar111 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar11 = vcmpps_avx512vl(auVar110,auVar111,1);
        auVar112 = vxorps_avx512vl(ZEXT1632(auVar83),auVar96);
        auVar114 = vrcp14ps_avx512vl(ZEXT1632(auVar84));
        auVar195 = ZEXT1632(auVar84);
        auVar119 = vxorps_avx512vl(auVar195,auVar96);
        auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar120 = vfnmadd213ps_avx512vl(auVar114,auVar195,auVar95);
        auVar83 = vfmadd132ps_fma(auVar120,auVar114,auVar114);
        fVar211 = auVar83._0_4_ * auVar112._0_4_;
        fVar220 = auVar83._4_4_ * auVar112._4_4_;
        auVar51._4_4_ = fVar220;
        auVar51._0_4_ = fVar211;
        fVar221 = auVar83._8_4_ * auVar112._8_4_;
        auVar51._8_4_ = fVar221;
        fVar222 = auVar83._12_4_ * auVar112._12_4_;
        auVar51._12_4_ = fVar222;
        fVar140 = auVar112._16_4_ * 0.0;
        auVar51._16_4_ = fVar140;
        fVar154 = auVar112._20_4_ * 0.0;
        auVar51._20_4_ = fVar154;
        fVar155 = auVar112._24_4_ * 0.0;
        auVar51._24_4_ = fVar155;
        auVar51._28_4_ = auVar112._28_4_;
        uVar13 = vcmpps_avx512vl(auVar195,auVar119,1);
        bVar71 = (byte)uVar11 | (byte)uVar13;
        auVar246._8_4_ = 0xff800000;
        auVar246._0_8_ = 0xff800000ff800000;
        auVar246._12_4_ = 0xff800000;
        auVar246._16_4_ = 0xff800000;
        auVar246._20_4_ = 0xff800000;
        auVar246._24_4_ = 0xff800000;
        auVar246._28_4_ = 0xff800000;
        auVar114 = vblendmps_avx512vl(auVar51,auVar246);
        auVar121._0_4_ = (uint)(bVar71 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar71 & 1) * -0x800000
        ;
        bVar78 = (bool)(bVar71 >> 1 & 1);
        auVar121._4_4_ = (uint)bVar78 * auVar114._4_4_ | (uint)!bVar78 * -0x800000;
        bVar78 = (bool)(bVar71 >> 2 & 1);
        auVar121._8_4_ = (uint)bVar78 * auVar114._8_4_ | (uint)!bVar78 * -0x800000;
        bVar78 = (bool)(bVar71 >> 3 & 1);
        auVar121._12_4_ = (uint)bVar78 * auVar114._12_4_ | (uint)!bVar78 * -0x800000;
        bVar78 = (bool)(bVar71 >> 4 & 1);
        auVar121._16_4_ = (uint)bVar78 * auVar114._16_4_ | (uint)!bVar78 * -0x800000;
        bVar78 = (bool)(bVar71 >> 5 & 1);
        auVar121._20_4_ = (uint)bVar78 * auVar114._20_4_ | (uint)!bVar78 * -0x800000;
        bVar78 = (bool)(bVar71 >> 6 & 1);
        auVar121._24_4_ = (uint)bVar78 * auVar114._24_4_ | (uint)!bVar78 * -0x800000;
        auVar121._28_4_ =
             (uint)(bVar71 >> 7) * auVar114._28_4_ | (uint)!(bool)(bVar71 >> 7) * -0x800000;
        auVar114 = vmaxps_avx512vl(auVar109,auVar121);
        auVar247 = ZEXT3264(auVar114);
        uVar13 = vcmpps_avx512vl(auVar195,auVar119,6);
        bVar71 = (byte)uVar11 | (byte)uVar13;
        auVar122._0_4_ = (uint)(bVar71 & 1) * 0x7f800000 | (uint)!(bool)(bVar71 & 1) * (int)fVar211;
        bVar78 = (bool)(bVar71 >> 1 & 1);
        auVar122._4_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar220;
        bVar78 = (bool)(bVar71 >> 2 & 1);
        auVar122._8_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar221;
        bVar78 = (bool)(bVar71 >> 3 & 1);
        auVar122._12_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar222;
        bVar78 = (bool)(bVar71 >> 4 & 1);
        auVar122._16_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar140;
        bVar78 = (bool)(bVar71 >> 5 & 1);
        auVar122._20_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar154;
        bVar78 = (bool)(bVar71 >> 6 & 1);
        auVar122._24_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar155;
        auVar122._28_4_ =
             (uint)(bVar71 >> 7) * 0x7f800000 | (uint)!(bool)(bVar71 >> 7) * auVar112._28_4_;
        auVar108 = vminps_avx512vl(auVar108,auVar122);
        auVar83 = vxorps_avx512vl(auVar109._0_16_,auVar109._0_16_);
        auVar93 = vsubps_avx512vl(ZEXT1632(auVar83),auVar93);
        auVar104 = vsubps_avx512vl(ZEXT1632(auVar83),auVar104);
        auVar109 = ZEXT1632(auVar83);
        auVar105 = vsubps_avx512vl(auVar109,auVar105);
        auVar105 = vmulps_avx512vl(auVar105,auVar107);
        auVar104 = vfmadd231ps_avx512vl(auVar105,auVar106,auVar104);
        auVar93 = vfmadd231ps_avx512vl(auVar104,auVar92,auVar93);
        auVar104 = vmulps_avx512vl(local_440,auVar107);
        auVar104 = vfmadd231ps_avx512vl(auVar104,local_420,auVar106);
        auVar104 = vfmadd231ps_avx512vl(auVar104,local_400,auVar92);
        vandps_avx512vl(auVar104,auVar110);
        uVar11 = vcmpps_avx512vl(auVar104,auVar111,1);
        auVar93 = vxorps_avx512vl(auVar93,auVar96);
        auVar105 = vrcp14ps_avx512vl(auVar104);
        auVar96 = vxorps_avx512vl(auVar104,auVar96);
        auVar242 = ZEXT3264(auVar96);
        auVar92 = vfnmadd213ps_avx512vl(auVar105,auVar104,auVar95);
        auVar83 = vfmadd132ps_fma(auVar92,auVar105,auVar105);
        fVar211 = auVar83._0_4_ * auVar93._0_4_;
        fVar220 = auVar83._4_4_ * auVar93._4_4_;
        auVar52._4_4_ = fVar220;
        auVar52._0_4_ = fVar211;
        fVar221 = auVar83._8_4_ * auVar93._8_4_;
        auVar52._8_4_ = fVar221;
        fVar222 = auVar83._12_4_ * auVar93._12_4_;
        auVar52._12_4_ = fVar222;
        fVar140 = auVar93._16_4_ * 0.0;
        auVar52._16_4_ = fVar140;
        fVar154 = auVar93._20_4_ * 0.0;
        auVar52._20_4_ = fVar154;
        fVar155 = auVar93._24_4_ * 0.0;
        auVar52._24_4_ = fVar155;
        auVar52._28_4_ = auVar93._28_4_;
        uVar13 = vcmpps_avx512vl(auVar104,auVar96,1);
        bVar71 = (byte)uVar11 | (byte)uVar13;
        auVar28._8_4_ = 0xff800000;
        auVar28._0_8_ = 0xff800000ff800000;
        auVar28._12_4_ = 0xff800000;
        auVar28._16_4_ = 0xff800000;
        auVar28._20_4_ = 0xff800000;
        auVar28._24_4_ = 0xff800000;
        auVar28._28_4_ = 0xff800000;
        auVar92 = vblendmps_avx512vl(auVar52,auVar28);
        auVar123._0_4_ =
             (uint)(bVar71 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar105._0_4_;
        bVar78 = (bool)(bVar71 >> 1 & 1);
        auVar123._4_4_ = (uint)bVar78 * auVar92._4_4_ | (uint)!bVar78 * auVar105._4_4_;
        bVar78 = (bool)(bVar71 >> 2 & 1);
        auVar123._8_4_ = (uint)bVar78 * auVar92._8_4_ | (uint)!bVar78 * auVar105._8_4_;
        bVar78 = (bool)(bVar71 >> 3 & 1);
        auVar123._12_4_ = (uint)bVar78 * auVar92._12_4_ | (uint)!bVar78 * auVar105._12_4_;
        bVar78 = (bool)(bVar71 >> 4 & 1);
        auVar123._16_4_ = (uint)bVar78 * auVar92._16_4_ | (uint)!bVar78 * auVar105._16_4_;
        bVar78 = (bool)(bVar71 >> 5 & 1);
        auVar123._20_4_ = (uint)bVar78 * auVar92._20_4_ | (uint)!bVar78 * auVar105._20_4_;
        bVar78 = (bool)(bVar71 >> 6 & 1);
        auVar123._24_4_ = (uint)bVar78 * auVar92._24_4_ | (uint)!bVar78 * auVar105._24_4_;
        auVar123._28_4_ =
             (uint)(bVar71 >> 7) * auVar92._28_4_ | (uint)!(bool)(bVar71 >> 7) * auVar105._28_4_;
        _local_720 = vmaxps_avx(auVar114,auVar123);
        auVar234 = ZEXT3264(_local_720);
        uVar13 = vcmpps_avx512vl(auVar104,auVar96,6);
        bVar71 = (byte)uVar11 | (byte)uVar13;
        auVar124._0_4_ = (uint)(bVar71 & 1) * 0x7f800000 | (uint)!(bool)(bVar71 & 1) * (int)fVar211;
        bVar78 = (bool)(bVar71 >> 1 & 1);
        auVar124._4_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar220;
        bVar78 = (bool)(bVar71 >> 2 & 1);
        auVar124._8_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar221;
        bVar78 = (bool)(bVar71 >> 3 & 1);
        auVar124._12_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar222;
        bVar78 = (bool)(bVar71 >> 4 & 1);
        auVar124._16_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar140;
        bVar78 = (bool)(bVar71 >> 5 & 1);
        auVar124._20_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar154;
        bVar78 = (bool)(bVar71 >> 6 & 1);
        auVar124._24_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar155;
        auVar124._28_4_ =
             (uint)(bVar71 >> 7) * 0x7f800000 | (uint)!(bool)(bVar71 >> 7) * auVar93._28_4_;
        local_340 = vminps_avx(auVar108,auVar124);
        auVar238 = ZEXT3264(local_340);
        uVar11 = vcmpps_avx512vl(_local_720,local_340,2);
        bVar67 = bVar67 & 0x7f & (byte)uVar11;
        if (bVar67 == 0) goto LAB_01ca7896;
        auVar104 = vmaxps_avx512vl(auVar109,local_6e0);
        auVar96 = vfmadd213ps_avx512vl(auVar103,auVar115,auVar91);
        auVar96 = vmulps_avx512vl(auVar94,auVar96);
        auVar103 = vfmadd213ps_avx512vl(local_540,auVar115,auVar91);
        auVar53._4_4_ = auVar94._4_4_ * auVar103._4_4_;
        auVar53._0_4_ = auVar94._0_4_ * auVar103._0_4_;
        auVar53._8_4_ = auVar94._8_4_ * auVar103._8_4_;
        auVar53._12_4_ = auVar94._12_4_ * auVar103._12_4_;
        auVar53._16_4_ = auVar94._16_4_ * auVar103._16_4_;
        auVar53._20_4_ = auVar94._20_4_ * auVar103._20_4_;
        auVar53._24_4_ = auVar94._24_4_ * auVar103._24_4_;
        auVar53._28_4_ = auVar123._28_4_;
        auVar96 = vminps_avx512vl(auVar96,auVar95);
        auVar60 = ZEXT812(0);
        auVar93 = ZEXT1232(auVar60) << 0x20;
        auVar96 = vmaxps_avx(auVar96,ZEXT1232(auVar60) << 0x20);
        auVar105 = vminps_avx512vl(auVar53,auVar95);
        auVar54._4_4_ = (auVar96._4_4_ + 1.0) * 0.125;
        auVar54._0_4_ = (auVar96._0_4_ + 0.0) * 0.125;
        auVar54._8_4_ = (auVar96._8_4_ + 2.0) * 0.125;
        auVar54._12_4_ = (auVar96._12_4_ + 3.0) * 0.125;
        auVar54._16_4_ = (auVar96._16_4_ + 4.0) * 0.125;
        auVar54._20_4_ = (auVar96._20_4_ + 5.0) * 0.125;
        auVar54._24_4_ = (auVar96._24_4_ + 6.0) * 0.125;
        auVar54._28_4_ = auVar96._28_4_ + 7.0;
        auVar83 = vfmadd213ps_fma(auVar54,local_8a0,auVar217);
        local_1e0 = ZEXT1632(auVar83);
        auVar96 = vmaxps_avx(auVar105,ZEXT1232(auVar60) << 0x20);
        auVar55._4_4_ = (auVar96._4_4_ + 1.0) * 0.125;
        auVar55._0_4_ = (auVar96._0_4_ + 0.0) * 0.125;
        auVar55._8_4_ = (auVar96._8_4_ + 2.0) * 0.125;
        auVar55._12_4_ = (auVar96._12_4_ + 3.0) * 0.125;
        auVar55._16_4_ = (auVar96._16_4_ + 4.0) * 0.125;
        auVar55._20_4_ = (auVar96._20_4_ + 5.0) * 0.125;
        auVar55._24_4_ = (auVar96._24_4_ + 6.0) * 0.125;
        auVar55._28_4_ = auVar96._28_4_ + 7.0;
        auVar83 = vfmadd213ps_fma(auVar55,local_8a0,auVar217);
        local_200 = ZEXT1632(auVar83);
        auVar56._4_4_ = auVar104._4_4_ * auVar104._4_4_;
        auVar56._0_4_ = auVar104._0_4_ * auVar104._0_4_;
        auVar56._8_4_ = auVar104._8_4_ * auVar104._8_4_;
        auVar56._12_4_ = auVar104._12_4_ * auVar104._12_4_;
        auVar56._16_4_ = auVar104._16_4_ * auVar104._16_4_;
        auVar56._20_4_ = auVar104._20_4_ * auVar104._20_4_;
        auVar56._24_4_ = auVar104._24_4_ * auVar104._24_4_;
        auVar56._28_4_ = auVar104._28_4_;
        auVar96 = vsubps_avx(local_700,auVar56);
        auVar57._4_4_ = auVar96._4_4_ * (float)local_7c0._4_4_;
        auVar57._0_4_ = auVar96._0_4_ * (float)local_7c0._0_4_;
        auVar57._8_4_ = auVar96._8_4_ * fStack_7b8;
        auVar57._12_4_ = auVar96._12_4_ * fStack_7b4;
        auVar57._16_4_ = auVar96._16_4_ * fStack_7b0;
        auVar57._20_4_ = auVar96._20_4_ * fStack_7ac;
        auVar57._24_4_ = auVar96._24_4_ * fStack_7a8;
        auVar57._28_4_ = auVar104._28_4_;
        auVar103 = vsubps_avx(local_7a0,auVar57);
        uVar79 = vcmpps_avx512vl(auVar103,ZEXT1232(auVar60) << 0x20,5);
        auVar258 = ZEXT3264(local_840);
        auVar260 = ZEXT3264(local_860);
        auVar261 = ZEXT3264(local_880);
        auVar262 = ZEXT3264(local_8c0);
        if ((byte)uVar79 == 0) {
          uVar79 = 0;
          auVar94 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar225 = ZEXT864(0) << 0x20;
          auVar95 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar103 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar240 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar125._8_4_ = 0x7f800000;
          auVar125._0_8_ = 0x7f8000007f800000;
          auVar125._12_4_ = 0x7f800000;
          auVar125._16_4_ = 0x7f800000;
          auVar125._20_4_ = 0x7f800000;
          auVar125._24_4_ = 0x7f800000;
          auVar125._28_4_ = 0x7f800000;
          auVar126._8_4_ = 0xff800000;
          auVar126._0_8_ = 0xff800000ff800000;
          auVar126._12_4_ = 0xff800000;
          auVar126._16_4_ = 0xff800000;
          auVar126._20_4_ = 0xff800000;
          auVar126._24_4_ = 0xff800000;
          auVar126._28_4_ = 0xff800000;
        }
        else {
          uVar72 = vcmpps_avx512vl(auVar103,auVar109,5);
          auVar103 = vsqrtps_avx(auVar103);
          auVar95 = vfnmadd213ps_avx512vl(auVar116,local_7e0,auVar95);
          auVar93 = vfmadd132ps_avx512vl(auVar95,local_7e0,local_7e0);
          auVar95 = vsubps_avx(_local_560,auVar103);
          auVar104 = vmulps_avx512vl(auVar95,auVar93);
          auVar95 = vsubps_avx512vl(auVar103,auVar113);
          auVar92 = vmulps_avx512vl(auVar95,auVar93);
          auVar95 = vfmadd213ps_avx512vl(auVar115,auVar104,auVar91);
          auVar58._4_4_ = auVar94._4_4_ * auVar95._4_4_;
          auVar58._0_4_ = auVar94._0_4_ * auVar95._0_4_;
          auVar58._8_4_ = auVar94._8_4_ * auVar95._8_4_;
          auVar58._12_4_ = auVar94._12_4_ * auVar95._12_4_;
          auVar58._16_4_ = auVar94._16_4_ * auVar95._16_4_;
          auVar58._20_4_ = auVar94._20_4_ * auVar95._20_4_;
          auVar58._24_4_ = auVar94._24_4_ * auVar95._24_4_;
          auVar58._28_4_ = auVar105._28_4_;
          auVar95 = vmulps_avx512vl(local_400,auVar104);
          auVar103 = vmulps_avx512vl(local_420,auVar104);
          auVar93 = vmulps_avx512vl(local_440,auVar104);
          auVar105 = vfmadd213ps_avx512vl(auVar97,auVar58,auVar100);
          auVar95 = vsubps_avx512vl(auVar95,auVar105);
          auVar105 = vfmadd213ps_avx512vl(auVar98,auVar58,auVar101);
          auVar103 = vsubps_avx512vl(auVar103,auVar105);
          auVar83 = vfmadd213ps_fma(auVar58,auVar99,auVar102);
          auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar83));
          auVar240 = auVar93._0_28_;
          auVar93 = vfmadd213ps_avx512vl(auVar115,auVar92,auVar91);
          auVar105 = vmulps_avx512vl(auVar94,auVar93);
          auVar94 = vmulps_avx512vl(local_400,auVar92);
          auVar91 = vmulps_avx512vl(local_420,auVar92);
          auVar106 = vmulps_avx512vl(local_440,auVar92);
          auVar83 = vfmadd213ps_fma(auVar97,auVar105,auVar100);
          auVar93 = vsubps_avx(auVar94,ZEXT1632(auVar83));
          auVar83 = vfmadd213ps_fma(auVar98,auVar105,auVar101);
          auVar94 = vsubps_avx512vl(auVar91,ZEXT1632(auVar83));
          auVar83 = vfmadd213ps_fma(auVar99,auVar105,auVar102);
          auVar97 = vsubps_avx512vl(auVar106,ZEXT1632(auVar83));
          auVar225 = ZEXT3264(auVar97);
          auVar148._8_4_ = 0x7f800000;
          auVar148._0_8_ = 0x7f8000007f800000;
          auVar148._12_4_ = 0x7f800000;
          auVar148._16_4_ = 0x7f800000;
          auVar148._20_4_ = 0x7f800000;
          auVar148._24_4_ = 0x7f800000;
          auVar148._28_4_ = 0x7f800000;
          auVar97 = vblendmps_avx512vl(auVar148,auVar104);
          bVar78 = (bool)((byte)uVar72 & 1);
          auVar125._0_4_ = (uint)bVar78 * auVar97._0_4_ | (uint)!bVar78 * 0x7f800000;
          bVar78 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar125._4_4_ = (uint)bVar78 * auVar97._4_4_ | (uint)!bVar78 * 0x7f800000;
          bVar78 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar125._8_4_ = (uint)bVar78 * auVar97._8_4_ | (uint)!bVar78 * 0x7f800000;
          bVar78 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar125._12_4_ = (uint)bVar78 * auVar97._12_4_ | (uint)!bVar78 * 0x7f800000;
          bVar78 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar125._16_4_ = (uint)bVar78 * auVar97._16_4_ | (uint)!bVar78 * 0x7f800000;
          bVar78 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar125._20_4_ = (uint)bVar78 * auVar97._20_4_ | (uint)!bVar78 * 0x7f800000;
          bVar78 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar125._24_4_ = (uint)bVar78 * auVar97._24_4_ | (uint)!bVar78 * 0x7f800000;
          bVar78 = SUB81(uVar72 >> 7,0);
          auVar125._28_4_ = (uint)bVar78 * auVar97._28_4_ | (uint)!bVar78 * 0x7f800000;
          auVar196._8_4_ = 0xff800000;
          auVar196._0_8_ = 0xff800000ff800000;
          auVar196._12_4_ = 0xff800000;
          auVar196._16_4_ = 0xff800000;
          auVar196._20_4_ = 0xff800000;
          auVar196._24_4_ = 0xff800000;
          auVar196._28_4_ = 0xff800000;
          auVar97 = vblendmps_avx512vl(auVar196,auVar92);
          bVar78 = (bool)((byte)uVar72 & 1);
          auVar126._0_4_ = (uint)bVar78 * auVar97._0_4_ | (uint)!bVar78 * -0x800000;
          bVar78 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar126._4_4_ = (uint)bVar78 * auVar97._4_4_ | (uint)!bVar78 * -0x800000;
          bVar78 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar126._8_4_ = (uint)bVar78 * auVar97._8_4_ | (uint)!bVar78 * -0x800000;
          bVar78 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar126._12_4_ = (uint)bVar78 * auVar97._12_4_ | (uint)!bVar78 * -0x800000;
          bVar78 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar126._16_4_ = (uint)bVar78 * auVar97._16_4_ | (uint)!bVar78 * -0x800000;
          bVar78 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar126._20_4_ = (uint)bVar78 * auVar97._20_4_ | (uint)!bVar78 * -0x800000;
          bVar78 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar126._24_4_ = (uint)bVar78 * auVar97._24_4_ | (uint)!bVar78 * -0x800000;
          bVar78 = SUB81(uVar72 >> 7,0);
          auVar126._28_4_ = (uint)bVar78 * auVar97._28_4_ | (uint)!bVar78 * -0x800000;
          auVar29._8_4_ = 0x36000000;
          auVar29._0_8_ = 0x3600000036000000;
          auVar29._12_4_ = 0x36000000;
          auVar29._16_4_ = 0x36000000;
          auVar29._20_4_ = 0x36000000;
          auVar29._24_4_ = 0x36000000;
          auVar29._28_4_ = 0x36000000;
          auVar97 = vmulps_avx512vl(local_580,auVar29);
          uVar12 = vcmpps_avx512vl(auVar97,local_5a0,0xe);
          uVar72 = uVar72 & uVar12;
          bVar71 = (byte)uVar72;
          if (bVar71 != 0) {
            uVar12 = vcmpps_avx512vl(auVar96,ZEXT1632(ZEXT816(0) << 0x40),2);
            auVar230._8_4_ = 0x7f800000;
            auVar230._0_8_ = 0x7f8000007f800000;
            auVar230._12_4_ = 0x7f800000;
            auVar230._16_4_ = 0x7f800000;
            auVar230._20_4_ = 0x7f800000;
            auVar230._24_4_ = 0x7f800000;
            auVar230._28_4_ = 0x7f800000;
            auVar233._8_4_ = 0xff800000;
            auVar233._0_8_ = 0xff800000ff800000;
            auVar233._12_4_ = 0xff800000;
            auVar233._16_4_ = 0xff800000;
            auVar233._20_4_ = 0xff800000;
            auVar233._24_4_ = 0xff800000;
            auVar233._28_4_ = 0xff800000;
            auVar96 = vblendmps_avx512vl(auVar230,auVar233);
            bVar73 = (byte)uVar12;
            uVar80 = (uint)(bVar73 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar97._0_4_;
            bVar78 = (bool)((byte)(uVar12 >> 1) & 1);
            uVar132 = (uint)bVar78 * auVar96._4_4_ | (uint)!bVar78 * auVar97._4_4_;
            bVar78 = (bool)((byte)(uVar12 >> 2) & 1);
            uVar133 = (uint)bVar78 * auVar96._8_4_ | (uint)!bVar78 * auVar97._8_4_;
            bVar78 = (bool)((byte)(uVar12 >> 3) & 1);
            uVar134 = (uint)bVar78 * auVar96._12_4_ | (uint)!bVar78 * auVar97._12_4_;
            bVar78 = (bool)((byte)(uVar12 >> 4) & 1);
            uVar135 = (uint)bVar78 * auVar96._16_4_ | (uint)!bVar78 * auVar97._16_4_;
            bVar78 = (bool)((byte)(uVar12 >> 5) & 1);
            uVar136 = (uint)bVar78 * auVar96._20_4_ | (uint)!bVar78 * auVar97._20_4_;
            bVar78 = (bool)((byte)(uVar12 >> 6) & 1);
            uVar137 = (uint)bVar78 * auVar96._24_4_ | (uint)!bVar78 * auVar97._24_4_;
            bVar78 = SUB81(uVar12 >> 7,0);
            uVar138 = (uint)bVar78 * auVar96._28_4_ | (uint)!bVar78 * auVar97._28_4_;
            auVar125._0_4_ = (bVar71 & 1) * uVar80 | !(bool)(bVar71 & 1) * auVar125._0_4_;
            bVar78 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar125._4_4_ = bVar78 * uVar132 | !bVar78 * auVar125._4_4_;
            bVar78 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar125._8_4_ = bVar78 * uVar133 | !bVar78 * auVar125._8_4_;
            bVar78 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar125._12_4_ = bVar78 * uVar134 | !bVar78 * auVar125._12_4_;
            bVar78 = (bool)((byte)(uVar72 >> 4) & 1);
            auVar125._16_4_ = bVar78 * uVar135 | !bVar78 * auVar125._16_4_;
            bVar78 = (bool)((byte)(uVar72 >> 5) & 1);
            auVar125._20_4_ = bVar78 * uVar136 | !bVar78 * auVar125._20_4_;
            bVar78 = (bool)((byte)(uVar72 >> 6) & 1);
            auVar125._24_4_ = bVar78 * uVar137 | !bVar78 * auVar125._24_4_;
            bVar78 = SUB81(uVar72 >> 7,0);
            auVar125._28_4_ = bVar78 * uVar138 | !bVar78 * auVar125._28_4_;
            auVar96 = vblendmps_avx512vl(auVar233,auVar230);
            bVar78 = (bool)((byte)(uVar12 >> 1) & 1);
            bVar5 = (bool)((byte)(uVar12 >> 2) & 1);
            bVar6 = (bool)((byte)(uVar12 >> 3) & 1);
            bVar7 = (bool)((byte)(uVar12 >> 4) & 1);
            bVar8 = (bool)((byte)(uVar12 >> 5) & 1);
            bVar9 = (bool)((byte)(uVar12 >> 6) & 1);
            bVar10 = SUB81(uVar12 >> 7,0);
            auVar126._0_4_ =
                 (uint)(bVar71 & 1) *
                 ((uint)(bVar73 & 1) * auVar96._0_4_ | !(bool)(bVar73 & 1) * uVar80) |
                 !(bool)(bVar71 & 1) * auVar126._0_4_;
            bVar4 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar126._4_4_ =
                 (uint)bVar4 * ((uint)bVar78 * auVar96._4_4_ | !bVar78 * uVar132) |
                 !bVar4 * auVar126._4_4_;
            bVar78 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar126._8_4_ =
                 (uint)bVar78 * ((uint)bVar5 * auVar96._8_4_ | !bVar5 * uVar133) |
                 !bVar78 * auVar126._8_4_;
            bVar78 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar126._12_4_ =
                 (uint)bVar78 * ((uint)bVar6 * auVar96._12_4_ | !bVar6 * uVar134) |
                 !bVar78 * auVar126._12_4_;
            bVar78 = (bool)((byte)(uVar72 >> 4) & 1);
            auVar126._16_4_ =
                 (uint)bVar78 * ((uint)bVar7 * auVar96._16_4_ | !bVar7 * uVar135) |
                 !bVar78 * auVar126._16_4_;
            bVar78 = (bool)((byte)(uVar72 >> 5) & 1);
            auVar126._20_4_ =
                 (uint)bVar78 * ((uint)bVar8 * auVar96._20_4_ | !bVar8 * uVar136) |
                 !bVar78 * auVar126._20_4_;
            bVar78 = (bool)((byte)(uVar72 >> 6) & 1);
            auVar126._24_4_ =
                 (uint)bVar78 * ((uint)bVar9 * auVar96._24_4_ | !bVar9 * uVar137) |
                 !bVar78 * auVar126._24_4_;
            bVar78 = SUB81(uVar72 >> 7,0);
            auVar126._28_4_ =
                 (uint)bVar78 * ((uint)bVar10 * auVar96._28_4_ | !bVar10 * uVar138) |
                 !bVar78 * auVar126._28_4_;
            uVar79 = (ulong)(byte)((~bVar71 | bVar73) & (byte)uVar79);
          }
        }
        auVar259 = ZEXT3264(local_8e0);
        auVar251 = ZEXT3264(local_900);
        auVar252 = ZEXT3264(local_920);
        auVar253 = ZEXT3264(local_940);
        auVar255 = ZEXT3264(local_960);
        auVar257 = ZEXT3264(local_980);
        auVar263 = ZEXT3264(local_9a0);
        auVar247 = ZEXT3264(local_440);
        auVar231._0_4_ = local_440._0_4_ * auVar225._0_4_;
        auVar231._4_4_ = local_440._4_4_ * auVar225._4_4_;
        auVar231._8_4_ = local_440._8_4_ * auVar225._8_4_;
        auVar231._12_4_ = local_440._12_4_ * auVar225._12_4_;
        auVar231._16_4_ = local_440._16_4_ * auVar225._16_4_;
        auVar231._20_4_ = local_440._20_4_ * auVar225._20_4_;
        auVar231._28_36_ = auVar225._28_36_;
        auVar231._24_4_ = local_440._24_4_ * auVar225._24_4_;
        auVar234 = ZEXT3264(local_420);
        auVar83 = vfmadd231ps_fma(auVar231._0_32_,local_420,auVar94);
        auVar231 = ZEXT3264(local_400);
        auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),local_400,auVar93);
        auVar229._8_4_ = 0x7fffffff;
        auVar229._0_8_ = 0x7fffffff7fffffff;
        auVar229._12_4_ = 0x7fffffff;
        auVar229._16_4_ = 0x7fffffff;
        auVar229._20_4_ = 0x7fffffff;
        auVar229._24_4_ = 0x7fffffff;
        auVar229._28_4_ = 0x7fffffff;
        auVar96 = vandps_avx(ZEXT1632(auVar83),auVar229);
        auVar242 = ZEXT3264(_local_720);
        _local_1c0 = _local_720;
        auVar224._8_4_ = 0x3e99999a;
        auVar224._0_8_ = 0x3e99999a3e99999a;
        auVar224._12_4_ = 0x3e99999a;
        auVar224._16_4_ = 0x3e99999a;
        auVar224._20_4_ = 0x3e99999a;
        auVar224._24_4_ = 0x3e99999a;
        auVar224._28_4_ = 0x3e99999a;
        uVar11 = vcmpps_avx512vl(auVar96,auVar224,1);
        local_3e0._0_2_ = (short)uVar11;
        auVar96 = vmaxps_avx(_local_720,auVar126);
        local_360 = auVar96;
        auVar94 = vminps_avx(local_340,auVar125);
        uVar11 = vcmpps_avx512vl(_local_720,auVar94,2);
        bVar71 = (byte)uVar11 & bVar67;
        uVar13 = vcmpps_avx512vl(auVar96,local_340,2);
        auVar254 = ZEXT3264(local_800);
        auVar256 = ZEXT3264(local_820);
        if ((bVar67 & ((byte)uVar13 | (byte)uVar11)) == 0) {
          auVar225 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
        }
        else {
          uVar72 = CONCAT71((int7)(uVar79 >> 8),~(byte)uVar79);
          auVar59._4_4_ = local_440._4_4_ * auVar240._4_4_;
          auVar59._0_4_ = local_440._0_4_ * auVar240._0_4_;
          auVar59._8_4_ = local_440._8_4_ * auVar240._8_4_;
          auVar59._12_4_ = local_440._12_4_ * auVar240._12_4_;
          auVar59._16_4_ = local_440._16_4_ * auVar240._16_4_;
          auVar59._20_4_ = local_440._20_4_ * auVar240._20_4_;
          auVar59._24_4_ = local_440._24_4_ * auVar240._24_4_;
          auVar59._28_4_ = auVar94._28_4_;
          auVar83 = vfmadd213ps_fma(auVar103,local_420,auVar59);
          auVar83 = vfmadd213ps_fma(auVar95,local_400,ZEXT1632(auVar83));
          auVar94 = vandps_avx(ZEXT1632(auVar83),auVar229);
          uVar11 = vcmpps_avx512vl(auVar94,auVar224,1);
          bVar73 = (byte)uVar11 | ~(byte)uVar79;
          auVar150._8_4_ = 2;
          auVar150._0_8_ = 0x200000002;
          auVar150._12_4_ = 2;
          auVar150._16_4_ = 2;
          auVar150._20_4_ = 2;
          auVar150._24_4_ = 2;
          auVar150._28_4_ = 2;
          auVar30._8_4_ = 3;
          auVar30._0_8_ = 0x300000003;
          auVar30._12_4_ = 3;
          auVar30._16_4_ = 3;
          auVar30._20_4_ = 3;
          auVar30._24_4_ = 3;
          auVar30._28_4_ = 3;
          auVar94 = vpblendmd_avx512vl(auVar150,auVar30);
          local_300._0_4_ = (uint)(bVar73 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar73 & 1) * 2;
          bVar78 = (bool)(bVar73 >> 1 & 1);
          local_300._4_4_ = (uint)bVar78 * auVar94._4_4_ | (uint)!bVar78 * 2;
          bVar78 = (bool)(bVar73 >> 2 & 1);
          local_300._8_4_ = (uint)bVar78 * auVar94._8_4_ | (uint)!bVar78 * 2;
          bVar78 = (bool)(bVar73 >> 3 & 1);
          local_300._12_4_ = (uint)bVar78 * auVar94._12_4_ | (uint)!bVar78 * 2;
          bVar78 = (bool)(bVar73 >> 4 & 1);
          local_300._16_4_ = (uint)bVar78 * auVar94._16_4_ | (uint)!bVar78 * 2;
          bVar78 = (bool)(bVar73 >> 5 & 1);
          local_300._20_4_ = (uint)bVar78 * auVar94._20_4_ | (uint)!bVar78 * 2;
          bVar78 = (bool)(bVar73 >> 6 & 1);
          local_300._24_4_ = (uint)bVar78 * auVar94._24_4_ | (uint)!bVar78 * 2;
          local_300._28_4_ = (uint)(bVar73 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar73 >> 7) * 2;
          local_380 = vpbroadcastd_avx512vl();
          uVar11 = vpcmpd_avx512vl(local_380,local_300,5);
          bVar73 = (byte)uVar11 & bVar71;
          auVar225 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
          if (bVar73 == 0) {
            auVar152._4_4_ = uVar76;
            auVar152._0_4_ = uVar76;
            auVar152._8_4_ = uVar76;
            auVar152._12_4_ = uVar76;
            auVar152._16_4_ = uVar76;
            auVar152._20_4_ = uVar76;
            auVar152._24_4_ = uVar76;
            auVar152._28_4_ = uVar76;
          }
          else {
            local_320 = auVar96;
            local_9d0 = (uint)uVar72;
            auVar84 = vminps_avx(local_640._0_16_,local_680._0_16_);
            auVar83 = vmaxps_avx(local_640._0_16_,local_680._0_16_);
            auVar85 = vminps_avx(local_660._0_16_,local_6a0._0_16_);
            auVar89 = vminps_avx(auVar84,auVar85);
            auVar84 = vmaxps_avx(local_660._0_16_,local_6a0._0_16_);
            auVar85 = vmaxps_avx(auVar83,auVar84);
            auVar177._8_4_ = 0x7fffffff;
            auVar177._0_8_ = 0x7fffffff7fffffff;
            auVar177._12_4_ = 0x7fffffff;
            auVar83 = vandps_avx(auVar89,auVar177);
            auVar84 = vandps_avx(auVar85,auVar177);
            auVar83 = vmaxps_avx(auVar83,auVar84);
            auVar84 = vmovshdup_avx(auVar83);
            auVar84 = vmaxss_avx(auVar84,auVar83);
            auVar83 = vshufpd_avx(auVar83,auVar83,1);
            auVar83 = vmaxss_avx(auVar83,auVar84);
            fVar211 = auVar83._0_4_ * 1.9073486e-06;
            local_610 = vshufps_avx(auVar85,auVar85,0xff);
            local_3c0 = (float)local_720._0_4_ + (float)local_9c0._0_4_;
            fStack_3bc = (float)local_720._4_4_ + (float)local_9c0._4_4_;
            fStack_3b8 = fStack_718 + fStack_9b8;
            fStack_3b4 = fStack_714 + fStack_9b4;
            fStack_3b0 = fStack_710 + fStack_9b0;
            fStack_3ac = fStack_70c + fStack_9ac;
            fStack_3a8 = fStack_708 + fStack_9a8;
            fStack_3a4 = fStack_704 + fStack_9a4;
            do {
              auVar151._8_4_ = 0x7f800000;
              auVar151._0_8_ = 0x7f8000007f800000;
              auVar151._12_4_ = 0x7f800000;
              auVar151._16_4_ = 0x7f800000;
              auVar151._20_4_ = 0x7f800000;
              auVar151._24_4_ = 0x7f800000;
              auVar151._28_4_ = 0x7f800000;
              auVar96 = vblendmps_avx512vl(auVar151,_local_720);
              auVar128._0_4_ =
                   (uint)(bVar73 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar73 & 1) * 0x7f800000;
              bVar78 = (bool)(bVar73 >> 1 & 1);
              auVar128._4_4_ = (uint)bVar78 * auVar96._4_4_ | (uint)!bVar78 * 0x7f800000;
              bVar78 = (bool)(bVar73 >> 2 & 1);
              auVar128._8_4_ = (uint)bVar78 * auVar96._8_4_ | (uint)!bVar78 * 0x7f800000;
              bVar78 = (bool)(bVar73 >> 3 & 1);
              auVar128._12_4_ = (uint)bVar78 * auVar96._12_4_ | (uint)!bVar78 * 0x7f800000;
              bVar78 = (bool)(bVar73 >> 4 & 1);
              auVar128._16_4_ = (uint)bVar78 * auVar96._16_4_ | (uint)!bVar78 * 0x7f800000;
              bVar78 = (bool)(bVar73 >> 5 & 1);
              auVar128._20_4_ = (uint)bVar78 * auVar96._20_4_ | (uint)!bVar78 * 0x7f800000;
              auVar128._24_4_ =
                   (uint)(bVar73 >> 6) * auVar96._24_4_ | (uint)!(bool)(bVar73 >> 6) * 0x7f800000;
              auVar128._28_4_ = 0x7f800000;
              auVar96 = vshufps_avx(auVar128,auVar128,0xb1);
              auVar96 = vminps_avx(auVar128,auVar96);
              auVar94 = vshufpd_avx(auVar96,auVar96,5);
              auVar96 = vminps_avx(auVar96,auVar94);
              auVar94 = vpermpd_avx2(auVar96,0x4e);
              auVar96 = vminps_avx(auVar96,auVar94);
              uVar11 = vcmpps_avx512vl(auVar128,auVar96,0);
              bVar68 = (byte)uVar11 & bVar73;
              bVar74 = bVar73;
              if (bVar68 != 0) {
                bVar74 = bVar68;
              }
              iVar15 = 0;
              for (uVar76 = (uint)bVar74; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000) {
                iVar15 = iVar15 + 1;
              }
              auVar225 = ZEXT464(*(uint *)(local_1e0 + (uint)(iVar15 << 2)));
              auVar234 = ZEXT464(*(uint *)(local_1c0 + (uint)(iVar15 << 2)));
              fVar220 = local_9c8;
              if ((float)local_6c0._0_4_ < 0.0) {
                local_8a0._0_16_ = ZEXT416(*(uint *)(local_1e0 + (uint)(iVar15 << 2)));
                local_7a0._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar15 << 2)));
                fVar220 = sqrtf((float)local_6c0._0_4_);
                auVar234 = ZEXT1664(local_7a0._0_16_);
                auVar225 = ZEXT1664(local_8a0._0_16_);
              }
              bVar78 = true;
              uVar79 = 0;
              do {
                local_7a0._0_16_ = auVar234._0_16_;
                uVar160 = auVar234._0_4_;
                auVar141._4_4_ = uVar160;
                auVar141._0_4_ = uVar160;
                auVar141._8_4_ = uVar160;
                auVar141._12_4_ = uVar160;
                auVar83 = vfmadd132ps_fma(auVar141,ZEXT816(0) << 0x40,local_6b0);
                fVar237 = auVar225._0_4_;
                fVar210 = 1.0 - fVar237;
                fVar236 = fVar210 * fVar210 * fVar210;
                fVar232 = fVar237 * fVar237;
                fVar209 = fVar237 * fVar232;
                auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar236),
                                          ZEXT416((uint)fVar209));
                fVar235 = fVar237 * fVar210;
                auVar212 = ZEXT416((uint)fVar210);
                auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar237 * fVar235 * 6.0)),
                                          ZEXT416((uint)(fVar235 * fVar210)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar209),
                                          ZEXT416((uint)fVar236));
                auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar235 * fVar210 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar237 * fVar235)));
                fVar236 = fVar236 * 0.16666667;
                fVar237 = (auVar84._0_4_ + auVar89._0_4_) * 0.16666667;
                fVar208 = (auVar85._0_4_ + auVar81._0_4_) * 0.16666667;
                fVar209 = fVar209 * 0.16666667;
                auVar178._0_4_ = fVar209 * (float)local_6a0._0_4_;
                auVar178._4_4_ = fVar209 * (float)local_6a0._4_4_;
                auVar178._8_4_ = fVar209 * fStack_698;
                auVar178._12_4_ = fVar209 * fStack_694;
                auVar213._4_4_ = fVar208;
                auVar213._0_4_ = fVar208;
                auVar213._8_4_ = fVar208;
                auVar213._12_4_ = fVar208;
                auVar84 = vfmadd132ps_fma(auVar213,auVar178,local_660._0_16_);
                auVar179._4_4_ = fVar237;
                auVar179._0_4_ = fVar237;
                auVar179._8_4_ = fVar237;
                auVar179._12_4_ = fVar237;
                auVar84 = vfmadd132ps_fma(auVar179,auVar84,local_680._0_16_);
                auVar162._4_4_ = fVar236;
                auVar162._0_4_ = fVar236;
                auVar162._8_4_ = fVar236;
                auVar162._12_4_ = fVar236;
                auVar84 = vfmadd132ps_fma(auVar162,auVar84,local_640._0_16_);
                local_540._0_16_ = auVar84;
                auVar83 = vsubps_avx(auVar83,auVar84);
                local_6e0._0_16_ = auVar83;
                auVar83 = vdpps_avx(auVar83,auVar83,0x7f);
                local_8a0._0_16_ = auVar225._0_16_;
                local_700._0_16_ = auVar83;
                if (auVar83._0_4_ < 0.0) {
                  local_7c0._0_4_ = fVar232;
                  local_7e0._0_4_ = fVar235;
                  auVar225._0_4_ = sqrtf(auVar83._0_4_);
                  auVar225._4_60_ = extraout_var;
                  auVar83 = auVar225._0_16_;
                  fVar235 = (float)local_7e0._0_4_;
                  auVar84 = local_8a0._0_16_;
                }
                else {
                  auVar83 = vsqrtss_avx(auVar83,auVar83);
                  local_7c0._0_4_ = fVar232;
                  auVar84 = auVar225._0_16_;
                }
                local_560._4_4_ = fVar210;
                local_560._0_4_ = fVar210;
                fStack_558 = fVar210;
                fStack_554 = fVar210;
                auVar85 = vfnmsub213ss_fma(auVar84,auVar84,ZEXT416((uint)(fVar235 * 4.0)));
                auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar235 * 4.0)),auVar212,auVar212);
                fVar232 = fVar210 * -fVar210 * 0.5;
                fVar235 = auVar85._0_4_ * 0.5;
                fVar236 = auVar84._0_4_ * 0.5;
                local_7c0._0_4_ = (float)local_7c0._0_4_ * 0.5;
                auVar204._0_4_ = (float)local_7c0._0_4_ * (float)local_6a0._0_4_;
                auVar204._4_4_ = (float)local_7c0._0_4_ * (float)local_6a0._4_4_;
                auVar204._8_4_ = (float)local_7c0._0_4_ * fStack_698;
                auVar204._12_4_ = (float)local_7c0._0_4_ * fStack_694;
                auVar163._4_4_ = fVar236;
                auVar163._0_4_ = fVar236;
                auVar163._8_4_ = fVar236;
                auVar163._12_4_ = fVar236;
                auVar84 = vfmadd132ps_fma(auVar163,auVar204,local_660._0_16_);
                auVar180._4_4_ = fVar235;
                auVar180._0_4_ = fVar235;
                auVar180._8_4_ = fVar235;
                auVar180._12_4_ = fVar235;
                auVar84 = vfmadd132ps_fma(auVar180,auVar84,local_680._0_16_);
                auVar244._4_4_ = fVar232;
                auVar244._0_4_ = fVar232;
                auVar244._8_4_ = fVar232;
                auVar244._12_4_ = fVar232;
                _local_7c0 = vfmadd132ps_fma(auVar244,auVar84,local_640._0_16_);
                local_580._0_16_ = vdpps_avx(_local_7c0,_local_7c0,0x7f);
                auVar61._12_4_ = 0;
                auVar61._0_12_ = ZEXT812(0);
                fVar232 = local_580._0_4_;
                auVar84 = vrsqrt14ss_avx512f(auVar61 << 0x20,ZEXT416((uint)fVar232));
                fVar235 = auVar84._0_4_;
                local_5a0._0_16_ = vrcp14ss_avx512f(auVar61 << 0x20,ZEXT416((uint)fVar232));
                auVar84 = vfnmadd213ss_fma(local_5a0._0_16_,local_580._0_16_,ZEXT416(0x40000000));
                local_770._0_4_ = auVar84._0_4_;
                local_7e0._0_4_ = auVar83._0_4_;
                if (fVar232 < -fVar232) {
                  auVar234._0_4_ = sqrtf(fVar232);
                  auVar234._4_60_ = extraout_var_00;
                  auVar83 = ZEXT416((uint)local_7e0._0_4_);
                  auVar85 = auVar234._0_16_;
                  auVar84 = _local_7c0;
                }
                else {
                  auVar85 = vsqrtss_avx512f(local_580._0_16_,local_580._0_16_);
                  auVar84 = _local_7c0;
                }
                fVar232 = fVar235 * 1.5 + fVar232 * -0.5 * fVar235 * fVar235 * fVar235;
                auVar142._0_4_ = auVar84._0_4_ * fVar232;
                auVar142._4_4_ = auVar84._4_4_ * fVar232;
                auVar142._8_4_ = auVar84._8_4_ * fVar232;
                auVar142._12_4_ = auVar84._12_4_ * fVar232;
                auVar89 = vdpps_avx(local_6e0._0_16_,auVar142,0x7f);
                fVar236 = auVar83._0_4_;
                auVar143._0_4_ = auVar89._0_4_ * auVar89._0_4_;
                auVar143._4_4_ = auVar89._4_4_ * auVar89._4_4_;
                auVar143._8_4_ = auVar89._8_4_ * auVar89._8_4_;
                auVar143._12_4_ = auVar89._12_4_ * auVar89._12_4_;
                auVar81 = vsubps_avx(local_700._0_16_,auVar143);
                fVar235 = auVar81._0_4_;
                auVar164._4_12_ = ZEXT812(0) << 0x20;
                auVar164._0_4_ = fVar235;
                auVar86 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar164);
                auVar82 = vmulss_avx512f(auVar86,ZEXT416(0x3fc00000));
                if (fVar235 < 0.0) {
                  local_5e0._0_4_ = auVar82._0_4_;
                  local_600 = fVar232;
                  fStack_5fc = fVar232;
                  fStack_5f8 = fVar232;
                  fStack_5f4 = fVar232;
                  local_5f0 = auVar86;
                  local_5d0 = auVar89;
                  fVar221 = sqrtf(fVar235);
                  auVar82 = ZEXT416((uint)local_5e0._0_4_);
                  auVar85 = ZEXT416(auVar85._0_4_);
                  auVar83 = ZEXT416((uint)local_7e0._0_4_);
                  auVar84 = _local_7c0;
                  auVar89 = local_5d0;
                  auVar86 = local_5f0;
                  fVar232 = local_600;
                  fVar237 = fStack_5fc;
                  fVar208 = fStack_5f8;
                  fVar209 = fStack_5f4;
                }
                else {
                  auVar81 = vsqrtss_avx(auVar81,auVar81);
                  fVar221 = auVar81._0_4_;
                  fVar237 = fVar232;
                  fVar208 = fVar232;
                  fVar209 = fVar232;
                }
                auVar247 = ZEXT1664(auVar84);
                auVar242 = ZEXT1664(local_700._0_16_);
                auVar238 = ZEXT1664(local_6e0._0_16_);
                auVar259 = ZEXT3264(local_8e0);
                auVar251 = ZEXT3264(local_900);
                auVar252 = ZEXT3264(local_920);
                auVar253 = ZEXT3264(local_940);
                auVar254 = ZEXT3264(local_800);
                auVar255 = ZEXT3264(local_960);
                auVar256 = ZEXT3264(local_820);
                auVar257 = ZEXT3264(local_980);
                auVar258 = ZEXT3264(local_840);
                auVar260 = ZEXT3264(local_860);
                auVar261 = ZEXT3264(local_880);
                auVar262 = ZEXT3264(local_8c0);
                auVar263 = ZEXT3264(local_9a0);
                auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar212,local_8a0._0_16_);
                auVar81 = vfmadd231ss_fma(auVar212,local_8a0._0_16_,SUB6416(ZEXT464(0xc0000000),0));
                fVar222 = local_8a0._0_4_;
                auVar181._0_4_ = fVar222 * (float)local_6a0._0_4_;
                auVar181._4_4_ = fVar222 * (float)local_6a0._4_4_;
                auVar181._8_4_ = fVar222 * fStack_698;
                auVar181._12_4_ = fVar222 * fStack_694;
                auVar205._0_4_ = auVar81._0_4_;
                auVar205._4_4_ = auVar205._0_4_;
                auVar205._8_4_ = auVar205._0_4_;
                auVar205._12_4_ = auVar205._0_4_;
                auVar81 = vfmadd132ps_fma(auVar205,auVar181,local_660._0_16_);
                auVar165._0_4_ = auVar88._0_4_;
                auVar165._4_4_ = auVar165._0_4_;
                auVar165._8_4_ = auVar165._0_4_;
                auVar165._12_4_ = auVar165._0_4_;
                auVar81 = vfmadd132ps_fma(auVar165,auVar81,local_680._0_16_);
                auVar81 = vfmadd132ps_fma(_local_560,auVar81,local_640._0_16_);
                auVar166._0_4_ = auVar81._0_4_ * (float)local_580._0_4_;
                auVar166._4_4_ = auVar81._4_4_ * (float)local_580._0_4_;
                auVar166._8_4_ = auVar81._8_4_ * (float)local_580._0_4_;
                auVar166._12_4_ = auVar81._12_4_ * (float)local_580._0_4_;
                auVar81 = vdpps_avx(auVar84,auVar81,0x7f);
                fVar210 = auVar81._0_4_;
                auVar182._0_4_ = auVar84._0_4_ * fVar210;
                auVar182._4_4_ = auVar84._4_4_ * fVar210;
                auVar182._8_4_ = auVar84._8_4_ * fVar210;
                auVar182._12_4_ = auVar84._12_4_ * fVar210;
                auVar81 = vsubps_avx(auVar166,auVar182);
                fVar210 = (float)local_770._0_4_ * (float)local_5a0._0_4_;
                auVar16._8_4_ = 0x80000000;
                auVar16._0_8_ = 0x8000000080000000;
                auVar16._12_4_ = 0x80000000;
                auVar87 = vxorps_avx512vl(auVar84,auVar16);
                auVar214._0_4_ = fVar232 * auVar81._0_4_ * fVar210;
                auVar214._4_4_ = fVar237 * auVar81._4_4_ * fVar210;
                auVar214._8_4_ = fVar208 * auVar81._8_4_ * fVar210;
                auVar214._12_4_ = fVar209 * auVar81._12_4_ * fVar210;
                auVar81 = vdpps_avx(auVar87,auVar142,0x7f);
                auVar212 = vmaxss_avx(ZEXT416((uint)fVar211),
                                      ZEXT416((uint)((float)local_7a0._0_4_ *
                                                    fVar220 * 1.9073486e-06)));
                auVar88 = vdivss_avx512f(ZEXT416((uint)fVar211),auVar85);
                auVar85 = vdpps_avx(local_6e0._0_16_,auVar214,0x7f);
                auVar83 = vfmadd213ss_fma(auVar83,ZEXT416((uint)fVar211),auVar212);
                auVar88 = vfmadd213ss_fma(ZEXT416((uint)(fVar236 + 1.0)),auVar88,auVar83);
                auVar83 = vdpps_avx(local_6b0,auVar142,0x7f);
                fVar232 = auVar81._0_4_ + auVar85._0_4_;
                auVar85 = vdpps_avx(local_6e0._0_16_,auVar87,0x7f);
                auVar87 = vmulss_avx512f(auVar86,ZEXT416((uint)(fVar235 * -0.5)));
                auVar86 = vmulss_avx512f(auVar86,auVar86);
                auVar81 = vdpps_avx(local_6e0._0_16_,local_6b0,0x7f);
                auVar87 = vaddss_avx512f(auVar82,ZEXT416((uint)(auVar87._0_4_ * auVar86._0_4_)));
                auVar86 = vfnmadd231ss_fma(auVar85,auVar89,ZEXT416((uint)fVar232));
                auVar82 = vfnmadd231ss_fma(auVar81,auVar89,auVar83);
                auVar85 = vpermilps_avx(local_540._0_16_,0xff);
                fVar221 = fVar221 - auVar85._0_4_;
                auVar85 = vshufps_avx(auVar84,auVar84,0xff);
                auVar81 = vfmsub213ss_fma(auVar86,auVar87,auVar85);
                fVar235 = auVar82._0_4_ * auVar87._0_4_;
                auVar86 = vfmsub231ss_fma(ZEXT416((uint)(auVar83._0_4_ * auVar81._0_4_)),
                                          ZEXT416((uint)fVar232),ZEXT416((uint)fVar235));
                fVar236 = auVar86._0_4_;
                fVar222 = fVar222 - (auVar89._0_4_ * (fVar235 / fVar236) -
                                    fVar221 * (auVar83._0_4_ / fVar236));
                auVar225 = ZEXT464((uint)fVar222);
                fVar140 = (float)local_7a0._0_4_ -
                          (fVar221 * (fVar232 / fVar236) - auVar89._0_4_ * (auVar81._0_4_ / fVar236)
                          );
                auVar234 = ZEXT464((uint)fVar140);
                auVar17._8_4_ = 0x7fffffff;
                auVar17._0_8_ = 0x7fffffff7fffffff;
                auVar17._12_4_ = 0x7fffffff;
                auVar83 = vandps_avx512vl(auVar89,auVar17);
                fVar232 = (float)local_9c0._0_4_;
                fVar235 = (float)local_9c0._4_4_;
                fVar236 = fStack_9b8;
                fVar237 = fStack_9b4;
                fVar208 = fStack_9b0;
                fVar209 = fStack_9ac;
                fVar210 = fStack_9a8;
                fVar203 = fStack_9a4;
                if (auVar83._0_4_ < auVar88._0_4_) {
                  auVar83 = vfmadd231ss_fma(ZEXT416((uint)(auVar88._0_4_ + auVar212._0_4_)),
                                            local_610,ZEXT416(0x36000000));
                  auVar18._8_4_ = 0x7fffffff;
                  auVar18._0_8_ = 0x7fffffff7fffffff;
                  auVar18._12_4_ = 0x7fffffff;
                  auVar89 = vandps_avx512vl(ZEXT416((uint)fVar221),auVar18);
                  if (auVar89._0_4_ < auVar83._0_4_) {
                    fVar220 = fVar140 + (float)local_620._0_4_;
                    auVar225 = ZEXT3264(CONCAT428(0x3f800000,
                                                  CONCAT424(0x3f800000,
                                                            CONCAT420(0x3f800000,
                                                                      CONCAT416(0x3f800000,
                                                                                CONCAT412(0x3f800000
                                                                                          ,CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                    if (fVar139 <= fVar220) {
                      fVar221 = *(float *)(ray + k * 4 + 0x80);
                      bVar74 = 0;
                      if (((fVar221 < fVar220) || (fVar222 < 0.0)) || (bVar74 = 0, 1.0 < fVar222))
                      goto LAB_01ca838f;
                      auVar183._4_12_ = SUB1612(ZEXT816(0),0);
                      auVar183._0_4_ = local_700._0_4_;
                      auVar83 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar183);
                      fVar154 = auVar83._0_4_;
                      pGVar2 = (context->scene->geometries).items[local_758].ptr;
                      if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (bVar74 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                        goto LAB_01ca838f;
                        fVar154 = fVar154 * 1.5 +
                                  local_700._0_4_ * -0.5 * fVar154 * fVar154 * fVar154;
                        auVar184._0_4_ = local_6e0._0_4_ * fVar154;
                        auVar184._4_4_ = local_6e0._4_4_ * fVar154;
                        auVar184._8_4_ = local_6e0._8_4_ * fVar154;
                        auVar184._12_4_ = local_6e0._12_4_ * fVar154;
                        auVar81 = vfmadd213ps_fma(auVar85,auVar184,auVar84);
                        auVar83 = vshufps_avx(auVar184,auVar184,0xc9);
                        auVar85 = vshufps_avx(auVar84,auVar84,0xc9);
                        auVar185._0_4_ = auVar184._0_4_ * auVar85._0_4_;
                        auVar185._4_4_ = auVar184._4_4_ * auVar85._4_4_;
                        auVar185._8_4_ = auVar184._8_4_ * auVar85._8_4_;
                        auVar185._12_4_ = auVar184._12_4_ * auVar85._12_4_;
                        auVar89 = vfmsub231ps_fma(auVar185,auVar84,auVar83);
                        auVar83 = vshufps_avx(auVar89,auVar89,0xc9);
                        auVar85 = vshufps_avx(auVar81,auVar81,0xc9);
                        auVar89 = vshufps_avx(auVar89,auVar89,0xd2);
                        auVar144._0_4_ = auVar81._0_4_ * auVar89._0_4_;
                        auVar144._4_4_ = auVar81._4_4_ * auVar89._4_4_;
                        auVar144._8_4_ = auVar81._8_4_ * auVar89._8_4_;
                        auVar144._12_4_ = auVar81._12_4_ * auVar89._12_4_;
                        auVar83 = vfmsub231ps_fma(auVar144,auVar83,auVar85);
                        local_4e0 = (RTCHitN  [16])vshufps_avx(auVar83,auVar83,0x55);
                        auStack_4d0 = vshufps_avx(auVar83,auVar83,0xaa);
                        local_4c0 = auVar83._0_4_;
                        uStack_4bc = local_4c0;
                        uStack_4b8 = local_4c0;
                        uStack_4b4 = local_4c0;
                        local_4b0 = fVar222;
                        fStack_4ac = fVar222;
                        fStack_4a8 = fVar222;
                        fStack_4a4 = fVar222;
                        local_4a0 = ZEXT416(0) << 0x20;
                        local_490 = local_4f0._0_8_;
                        uStack_488 = local_4f0._8_8_;
                        local_480 = local_500;
                        vpcmpeqd_avx2(ZEXT1632(local_500),ZEXT1632(local_500));
                        uStack_46c = context->user->instID[0];
                        local_470 = uStack_46c;
                        uStack_468 = uStack_46c;
                        uStack_464 = uStack_46c;
                        uStack_460 = context->user->instPrimID[0];
                        uStack_45c = uStack_460;
                        uStack_458 = uStack_460;
                        uStack_454 = uStack_460;
                        *(float *)(ray + k * 4 + 0x80) = fVar220;
                        local_9e0 = local_510;
                        local_750.valid = (int *)local_9e0;
                        local_750.geometryUserPtr = pGVar2->userPtr;
                        local_750.context = context->user;
                        local_750.hit = local_4e0;
                        local_750.N = 4;
                        local_750.ray = (RTCRayN *)ray;
                        if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar234 = ZEXT464((uint)fVar140);
                          auVar238 = ZEXT1664(local_6e0._0_16_);
                          auVar242 = ZEXT1664(local_700._0_16_);
                          auVar247 = ZEXT1664(auVar84);
                          (*pGVar2->occlusionFilterN)(&local_750);
                          auVar263 = ZEXT3264(local_9a0);
                          auVar262 = ZEXT3264(local_8c0);
                          auVar261 = ZEXT3264(local_880);
                          auVar260 = ZEXT3264(local_860);
                          auVar258 = ZEXT3264(local_840);
                          auVar257 = ZEXT3264(local_980);
                          auVar256 = ZEXT3264(local_820);
                          auVar255 = ZEXT3264(local_960);
                          auVar254 = ZEXT3264(local_800);
                          auVar253 = ZEXT3264(local_940);
                          auVar252 = ZEXT3264(local_920);
                          auVar251 = ZEXT3264(local_900);
                          auVar259 = ZEXT3264(local_8e0);
                          auVar225 = ZEXT3264(CONCAT428(0x3f800000,
                                                        CONCAT424(0x3f800000,
                                                                  CONCAT420(0x3f800000,
                                                                            CONCAT416(0x3f800000,
                                                                                      CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                          fVar232 = (float)local_9c0._0_4_;
                          fVar235 = (float)local_9c0._4_4_;
                          fVar236 = fStack_9b8;
                          fVar237 = fStack_9b4;
                          fVar208 = fStack_9b0;
                          fVar209 = fStack_9ac;
                          fVar210 = fStack_9a8;
                          fVar203 = fStack_9a4;
                        }
                        uVar79 = vptestmd_avx512vl(local_9e0,local_9e0);
                        if ((uVar79 & 0xf) != 0) {
                          p_Var3 = context->args->filter;
                          if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar234 = ZEXT1664(auVar234._0_16_);
                            auVar238 = ZEXT1664(auVar238._0_16_);
                            auVar242 = ZEXT1664(auVar242._0_16_);
                            auVar247 = ZEXT1664(auVar247._0_16_);
                            (*p_Var3)(&local_750);
                            auVar263 = ZEXT3264(local_9a0);
                            auVar262 = ZEXT3264(local_8c0);
                            auVar261 = ZEXT3264(local_880);
                            auVar260 = ZEXT3264(local_860);
                            auVar258 = ZEXT3264(local_840);
                            auVar257 = ZEXT3264(local_980);
                            auVar256 = ZEXT3264(local_820);
                            auVar255 = ZEXT3264(local_960);
                            auVar254 = ZEXT3264(local_800);
                            auVar253 = ZEXT3264(local_940);
                            auVar252 = ZEXT3264(local_920);
                            auVar251 = ZEXT3264(local_900);
                            auVar259 = ZEXT3264(local_8e0);
                            auVar225 = ZEXT3264(CONCAT428(0x3f800000,
                                                          CONCAT424(0x3f800000,
                                                                    CONCAT420(0x3f800000,
                                                                              CONCAT416(0x3f800000,
                                                                                        CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                            fVar232 = (float)local_9c0._0_4_;
                            fVar235 = (float)local_9c0._4_4_;
                            fVar236 = fStack_9b8;
                            fVar237 = fStack_9b4;
                            fVar208 = fStack_9b0;
                            fVar209 = fStack_9ac;
                            fVar210 = fStack_9a8;
                            fVar203 = fStack_9a4;
                          }
                          uVar79 = vptestmd_avx512vl(local_9e0,local_9e0);
                          uVar79 = uVar79 & 0xf;
                          auVar83 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar4 = (bool)((byte)uVar79 & 1);
                          bVar5 = (bool)((byte)(uVar79 >> 1) & 1);
                          bVar6 = (bool)((byte)(uVar79 >> 2) & 1);
                          bVar7 = SUB81(uVar79 >> 3,0);
                          *(uint *)(local_750.ray + 0x80) =
                               (uint)bVar4 * auVar83._0_4_ |
                               (uint)!bVar4 * *(int *)(local_750.ray + 0x80);
                          *(uint *)(local_750.ray + 0x84) =
                               (uint)bVar5 * auVar83._4_4_ |
                               (uint)!bVar5 * *(int *)(local_750.ray + 0x84);
                          *(uint *)(local_750.ray + 0x88) =
                               (uint)bVar6 * auVar83._8_4_ |
                               (uint)!bVar6 * *(int *)(local_750.ray + 0x88);
                          *(uint *)(local_750.ray + 0x8c) =
                               (uint)bVar7 * auVar83._12_4_ |
                               (uint)!bVar7 * *(int *)(local_750.ray + 0x8c);
                          bVar74 = 1;
                          if ((byte)uVar79 != 0) goto LAB_01ca838f;
                        }
                        *(float *)(ray + k * 4 + 0x80) = fVar221;
                        bVar74 = 0;
                        goto LAB_01ca838f;
                      }
                    }
                    bVar74 = 0;
                    goto LAB_01ca838f;
                  }
                }
                bVar78 = uVar79 < 4;
                uVar79 = uVar79 + 1;
              } while (uVar79 != 5);
              bVar78 = false;
              auVar225 = ZEXT3264(CONCAT428(0x3f800000,
                                            CONCAT424(0x3f800000,
                                                      CONCAT420(0x3f800000,
                                                                CONCAT416(0x3f800000,
                                                                          CONCAT412(0x3f800000,
                                                                                    CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
              bVar74 = 5;
LAB_01ca838f:
              bVar77 = (bool)(bVar77 | bVar78 & bVar74);
              uVar160 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar152._4_4_ = uVar160;
              auVar152._0_4_ = uVar160;
              auVar152._8_4_ = uVar160;
              auVar152._12_4_ = uVar160;
              auVar152._16_4_ = uVar160;
              auVar152._20_4_ = uVar160;
              auVar152._24_4_ = uVar160;
              auVar152._28_4_ = uVar160;
              auVar63._4_4_ = fStack_3bc;
              auVar63._0_4_ = local_3c0;
              auVar63._8_4_ = fStack_3b8;
              auVar63._12_4_ = fStack_3b4;
              auVar63._16_4_ = fStack_3b0;
              auVar63._20_4_ = fStack_3ac;
              auVar63._24_4_ = fStack_3a8;
              auVar63._28_4_ = fStack_3a4;
              uVar11 = vcmpps_avx512vl(auVar152,auVar63,0xd);
              bVar73 = ~('\x01' << ((byte)iVar15 & 0x1f)) & bVar73 & (byte)uVar11;
            } while (bVar73 != 0);
            uVar72 = (ulong)local_9d0;
            auVar96 = local_320;
          }
          auVar231 = ZEXT3264(local_360);
          bVar73 = local_3e0[0] | (byte)uVar72;
          auVar174._0_4_ = fVar232 + auVar96._0_4_;
          auVar174._4_4_ = fVar235 + auVar96._4_4_;
          auVar174._8_4_ = fVar236 + auVar96._8_4_;
          auVar174._12_4_ = fVar237 + auVar96._12_4_;
          auVar174._16_4_ = fVar208 + auVar96._16_4_;
          auVar174._20_4_ = fVar209 + auVar96._20_4_;
          auVar174._24_4_ = fVar210 + auVar96._24_4_;
          auVar174._28_4_ = fVar203 + auVar96._28_4_;
          uVar11 = vcmpps_avx512vl(auVar174,auVar152,2);
          bVar74 = (byte)uVar13 & bVar67 & (byte)uVar11;
          auVar175._8_4_ = 2;
          auVar175._0_8_ = 0x200000002;
          auVar175._12_4_ = 2;
          auVar175._16_4_ = 2;
          auVar175._20_4_ = 2;
          auVar175._24_4_ = 2;
          auVar175._28_4_ = 2;
          auVar31._8_4_ = 3;
          auVar31._0_8_ = 0x300000003;
          auVar31._12_4_ = 3;
          auVar31._16_4_ = 3;
          auVar31._20_4_ = 3;
          auVar31._24_4_ = 3;
          auVar31._28_4_ = 3;
          auVar96 = vpblendmd_avx512vl(auVar175,auVar31);
          auVar129._0_4_ = (uint)(bVar73 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar73 & 1) * 2;
          bVar78 = (bool)(bVar73 >> 1 & 1);
          auVar129._4_4_ = (uint)bVar78 * auVar96._4_4_ | (uint)!bVar78 * 2;
          bVar78 = (bool)(bVar73 >> 2 & 1);
          auVar129._8_4_ = (uint)bVar78 * auVar96._8_4_ | (uint)!bVar78 * 2;
          bVar78 = (bool)(bVar73 >> 3 & 1);
          auVar129._12_4_ = (uint)bVar78 * auVar96._12_4_ | (uint)!bVar78 * 2;
          bVar78 = (bool)(bVar73 >> 4 & 1);
          auVar129._16_4_ = (uint)bVar78 * auVar96._16_4_ | (uint)!bVar78 * 2;
          bVar78 = (bool)(bVar73 >> 5 & 1);
          auVar129._20_4_ = (uint)bVar78 * auVar96._20_4_ | (uint)!bVar78 * 2;
          bVar78 = (bool)(bVar73 >> 6 & 1);
          auVar129._24_4_ = (uint)bVar78 * auVar96._24_4_ | (uint)!bVar78 * 2;
          auVar129._28_4_ = (uint)(bVar73 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar73 >> 7) * 2;
          uVar11 = vpcmpd_avx512vl(local_380,auVar129,5);
          bVar67 = (byte)uVar11 & bVar74;
          if (bVar67 != 0) {
            local_3e0 = auVar129;
            auVar84 = vminps_avx(local_640._0_16_,local_680._0_16_);
            auVar83 = vmaxps_avx(local_640._0_16_,local_680._0_16_);
            auVar85 = vminps_avx(local_660._0_16_,local_6a0._0_16_);
            auVar89 = vminps_avx(auVar84,auVar85);
            auVar84 = vmaxps_avx(local_660._0_16_,local_6a0._0_16_);
            auVar85 = vmaxps_avx(auVar83,auVar84);
            auVar186._8_4_ = 0x7fffffff;
            auVar186._0_8_ = 0x7fffffff7fffffff;
            auVar186._12_4_ = 0x7fffffff;
            auVar83 = vandps_avx(auVar89,auVar186);
            auVar84 = vandps_avx(auVar85,auVar186);
            auVar83 = vmaxps_avx(auVar83,auVar84);
            auVar84 = vmovshdup_avx(auVar83);
            auVar84 = vmaxss_avx(auVar84,auVar83);
            auVar83 = vshufpd_avx(auVar83,auVar83,1);
            auVar83 = vmaxss_avx(auVar83,auVar84);
            fVar211 = auVar83._0_4_ * 1.9073486e-06;
            local_610 = vshufps_avx(auVar85,auVar85,0xff);
            local_3c0 = fVar232 + local_360._0_4_;
            fStack_3bc = fVar235 + local_360._4_4_;
            fStack_3b8 = fVar236 + local_360._8_4_;
            fStack_3b4 = fVar237 + local_360._12_4_;
            fStack_3b0 = fVar208 + local_360._16_4_;
            fStack_3ac = fVar209 + local_360._20_4_;
            fStack_3a8 = fVar210 + local_360._24_4_;
            fStack_3a4 = fVar203 + local_360._28_4_;
            _local_720 = local_360;
            do {
              auVar153._8_4_ = 0x7f800000;
              auVar153._0_8_ = 0x7f8000007f800000;
              auVar153._12_4_ = 0x7f800000;
              auVar153._16_4_ = 0x7f800000;
              auVar153._20_4_ = 0x7f800000;
              auVar153._24_4_ = 0x7f800000;
              auVar153._28_4_ = 0x7f800000;
              auVar96 = vblendmps_avx512vl(auVar153,auVar231._0_32_);
              auVar130._0_4_ =
                   (uint)(bVar67 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar67 & 1) * 0x7f800000;
              bVar78 = (bool)(bVar67 >> 1 & 1);
              auVar130._4_4_ = (uint)bVar78 * auVar96._4_4_ | (uint)!bVar78 * 0x7f800000;
              bVar78 = (bool)(bVar67 >> 2 & 1);
              auVar130._8_4_ = (uint)bVar78 * auVar96._8_4_ | (uint)!bVar78 * 0x7f800000;
              bVar78 = (bool)(bVar67 >> 3 & 1);
              auVar130._12_4_ = (uint)bVar78 * auVar96._12_4_ | (uint)!bVar78 * 0x7f800000;
              bVar78 = (bool)(bVar67 >> 4 & 1);
              auVar130._16_4_ = (uint)bVar78 * auVar96._16_4_ | (uint)!bVar78 * 0x7f800000;
              bVar78 = (bool)(bVar67 >> 5 & 1);
              auVar130._20_4_ = (uint)bVar78 * auVar96._20_4_ | (uint)!bVar78 * 0x7f800000;
              auVar130._24_4_ =
                   (uint)(bVar67 >> 6) * auVar96._24_4_ | (uint)!(bool)(bVar67 >> 6) * 0x7f800000;
              auVar130._28_4_ = 0x7f800000;
              auVar96 = vshufps_avx(auVar130,auVar130,0xb1);
              auVar96 = vminps_avx(auVar130,auVar96);
              auVar94 = vshufpd_avx(auVar96,auVar96,5);
              auVar96 = vminps_avx(auVar96,auVar94);
              auVar94 = vpermpd_avx2(auVar96,0x4e);
              auVar96 = vminps_avx(auVar96,auVar94);
              uVar11 = vcmpps_avx512vl(auVar130,auVar96,0);
              bVar68 = (byte)uVar11 & bVar67;
              bVar73 = bVar67;
              if (bVar68 != 0) {
                bVar73 = bVar68;
              }
              iVar15 = 0;
              for (uVar76 = (uint)bVar73; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000) {
                iVar15 = iVar15 + 1;
              }
              auVar225 = ZEXT464(*(uint *)(local_200 + (uint)(iVar15 << 2)));
              auVar234 = ZEXT464(*(uint *)(local_340 + (uint)(iVar15 << 2)));
              fVar220 = local_9c4;
              if ((float)local_6c0._0_4_ < 0.0) {
                local_8a0._0_16_ = ZEXT416(*(uint *)(local_200 + (uint)(iVar15 << 2)));
                local_7a0._0_16_ = ZEXT416(*(uint *)(local_340 + (uint)(iVar15 << 2)));
                fVar220 = sqrtf((float)local_6c0._0_4_);
                auVar234 = ZEXT1664(local_7a0._0_16_);
                auVar225 = ZEXT1664(local_8a0._0_16_);
              }
              bVar78 = true;
              uVar79 = 0;
              do {
                local_7a0._0_16_ = auVar234._0_16_;
                uVar160 = auVar234._0_4_;
                auVar145._4_4_ = uVar160;
                auVar145._0_4_ = uVar160;
                auVar145._8_4_ = uVar160;
                auVar145._12_4_ = uVar160;
                auVar83 = vfmadd132ps_fma(auVar145,ZEXT816(0) << 0x40,local_6b0);
                fVar237 = auVar225._0_4_;
                fVar210 = 1.0 - fVar237;
                fVar236 = fVar210 * fVar210 * fVar210;
                fVar232 = fVar237 * fVar237;
                fVar209 = fVar237 * fVar232;
                auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar236),
                                          ZEXT416((uint)fVar209));
                fVar235 = fVar237 * fVar210;
                auVar212 = ZEXT416((uint)fVar210);
                auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar237 * fVar235 * 6.0)),
                                          ZEXT416((uint)(fVar235 * fVar210)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar209),
                                          ZEXT416((uint)fVar236));
                auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar235 * fVar210 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar237 * fVar235)));
                fVar236 = fVar236 * 0.16666667;
                fVar237 = (auVar84._0_4_ + auVar89._0_4_) * 0.16666667;
                fVar208 = (auVar85._0_4_ + auVar81._0_4_) * 0.16666667;
                fVar209 = fVar209 * 0.16666667;
                auVar187._0_4_ = fVar209 * (float)local_6a0._0_4_;
                auVar187._4_4_ = fVar209 * (float)local_6a0._4_4_;
                auVar187._8_4_ = fVar209 * fStack_698;
                auVar187._12_4_ = fVar209 * fStack_694;
                auVar215._4_4_ = fVar208;
                auVar215._0_4_ = fVar208;
                auVar215._8_4_ = fVar208;
                auVar215._12_4_ = fVar208;
                auVar84 = vfmadd132ps_fma(auVar215,auVar187,local_660._0_16_);
                auVar188._4_4_ = fVar237;
                auVar188._0_4_ = fVar237;
                auVar188._8_4_ = fVar237;
                auVar188._12_4_ = fVar237;
                auVar84 = vfmadd132ps_fma(auVar188,auVar84,local_680._0_16_);
                auVar167._4_4_ = fVar236;
                auVar167._0_4_ = fVar236;
                auVar167._8_4_ = fVar236;
                auVar167._12_4_ = fVar236;
                auVar84 = vfmadd132ps_fma(auVar167,auVar84,local_640._0_16_);
                local_540._0_16_ = auVar84;
                auVar83 = vsubps_avx(auVar83,auVar84);
                local_6e0._0_16_ = auVar83;
                auVar83 = vdpps_avx(auVar83,auVar83,0x7f);
                local_8a0._0_16_ = auVar225._0_16_;
                local_700._0_16_ = auVar83;
                if (auVar83._0_4_ < 0.0) {
                  local_7c0._0_4_ = fVar232;
                  local_7e0._0_4_ = fVar235;
                  auVar238._0_4_ = sqrtf(auVar83._0_4_);
                  auVar238._4_60_ = extraout_var_01;
                  auVar83 = auVar238._0_16_;
                  fVar235 = (float)local_7e0._0_4_;
                  auVar84 = local_8a0._0_16_;
                }
                else {
                  auVar83 = vsqrtss_avx(auVar83,auVar83);
                  local_7c0._0_4_ = fVar232;
                  auVar84 = auVar225._0_16_;
                }
                local_560._4_4_ = fVar210;
                local_560._0_4_ = fVar210;
                fStack_558 = fVar210;
                fStack_554 = fVar210;
                auVar85 = vfnmsub213ss_fma(auVar84,auVar84,ZEXT416((uint)(fVar235 * 4.0)));
                auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar235 * 4.0)),auVar212,auVar212);
                fVar232 = fVar210 * -fVar210 * 0.5;
                fVar235 = auVar85._0_4_ * 0.5;
                fVar236 = auVar84._0_4_ * 0.5;
                local_7c0._0_4_ = (float)local_7c0._0_4_ * 0.5;
                auVar206._0_4_ = (float)local_7c0._0_4_ * (float)local_6a0._0_4_;
                auVar206._4_4_ = (float)local_7c0._0_4_ * (float)local_6a0._4_4_;
                auVar206._8_4_ = (float)local_7c0._0_4_ * fStack_698;
                auVar206._12_4_ = (float)local_7c0._0_4_ * fStack_694;
                auVar168._4_4_ = fVar236;
                auVar168._0_4_ = fVar236;
                auVar168._8_4_ = fVar236;
                auVar168._12_4_ = fVar236;
                auVar84 = vfmadd132ps_fma(auVar168,auVar206,local_660._0_16_);
                auVar189._4_4_ = fVar235;
                auVar189._0_4_ = fVar235;
                auVar189._8_4_ = fVar235;
                auVar189._12_4_ = fVar235;
                auVar84 = vfmadd132ps_fma(auVar189,auVar84,local_680._0_16_);
                auVar245._4_4_ = fVar232;
                auVar245._0_4_ = fVar232;
                auVar245._8_4_ = fVar232;
                auVar245._12_4_ = fVar232;
                _local_7c0 = vfmadd132ps_fma(auVar245,auVar84,local_640._0_16_);
                local_580._0_16_ = vdpps_avx(_local_7c0,_local_7c0,0x7f);
                auVar62._12_4_ = 0;
                auVar62._0_12_ = ZEXT812(0);
                fVar232 = local_580._0_4_;
                auVar84 = vrsqrt14ss_avx512f(auVar62 << 0x20,ZEXT416((uint)fVar232));
                fVar235 = auVar84._0_4_;
                local_5a0._0_16_ = vrcp14ss_avx512f(auVar62 << 0x20,ZEXT416((uint)fVar232));
                auVar84 = vfnmadd213ss_fma(local_5a0._0_16_,local_580._0_16_,ZEXT416(0x40000000));
                local_770._0_4_ = auVar84._0_4_;
                local_7e0._0_4_ = auVar83._0_4_;
                if (fVar232 < -fVar232) {
                  auVar242._0_4_ = sqrtf(fVar232);
                  auVar242._4_60_ = extraout_var_02;
                  auVar83 = ZEXT416((uint)local_7e0._0_4_);
                  auVar85 = auVar242._0_16_;
                  auVar84 = _local_7c0;
                }
                else {
                  auVar85 = vsqrtss_avx512f(local_580._0_16_,local_580._0_16_);
                  auVar84 = _local_7c0;
                }
                fVar232 = fVar235 * 1.5 + fVar232 * -0.5 * fVar235 * fVar235 * fVar235;
                auVar250._0_4_ = auVar84._0_4_ * fVar232;
                auVar250._4_4_ = auVar84._4_4_ * fVar232;
                auVar250._8_4_ = auVar84._8_4_ * fVar232;
                auVar250._12_4_ = auVar84._12_4_ * fVar232;
                auVar89 = vdpps_avx(local_6e0._0_16_,auVar250,0x7f);
                fVar237 = auVar83._0_4_;
                fVar235 = auVar89._0_4_;
                auVar146._0_4_ = fVar235 * fVar235;
                auVar146._4_4_ = auVar89._4_4_ * auVar89._4_4_;
                auVar146._8_4_ = auVar89._8_4_ * auVar89._8_4_;
                auVar146._12_4_ = auVar89._12_4_ * auVar89._12_4_;
                auVar81 = vsubps_avx(local_700._0_16_,auVar146);
                fVar236 = auVar81._0_4_;
                auVar169._4_12_ = ZEXT812(0) << 0x20;
                auVar169._0_4_ = fVar236;
                auVar86 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar169);
                auVar82 = vmulss_avx512f(auVar86,ZEXT416(0x3fc00000));
                if (fVar236 < 0.0) {
                  local_5d0._0_4_ = auVar85._0_4_;
                  local_600 = fVar232;
                  fStack_5fc = fVar232;
                  fStack_5f8 = fVar232;
                  fStack_5f4 = fVar232;
                  local_5f0 = auVar250;
                  local_5e0 = auVar86;
                  fVar221 = sqrtf(fVar236);
                  auVar82 = ZEXT416(auVar82._0_4_);
                  auVar85 = ZEXT416((uint)local_5d0._0_4_);
                  auVar83 = ZEXT416((uint)local_7e0._0_4_);
                  auVar84 = _local_7c0;
                  auVar250 = local_5f0;
                  auVar86 = local_5e0;
                  fVar232 = local_600;
                  fVar208 = fStack_5fc;
                  fVar209 = fStack_5f8;
                  fVar210 = fStack_5f4;
                }
                else {
                  auVar81 = vsqrtss_avx(auVar81,auVar81);
                  fVar221 = auVar81._0_4_;
                  fVar208 = fVar232;
                  fVar209 = fVar232;
                  fVar210 = fVar232;
                }
                auVar247 = ZEXT1664(auVar84);
                auVar242 = ZEXT1664(local_700._0_16_);
                auVar238 = ZEXT1664(local_6e0._0_16_);
                auVar259 = ZEXT3264(local_8e0);
                auVar251 = ZEXT3264(local_900);
                auVar252 = ZEXT3264(local_920);
                auVar253 = ZEXT3264(local_940);
                auVar254 = ZEXT3264(local_800);
                auVar255 = ZEXT3264(local_960);
                auVar256 = ZEXT3264(local_820);
                auVar257 = ZEXT3264(local_980);
                auVar258 = ZEXT3264(local_840);
                auVar260 = ZEXT3264(local_860);
                auVar261 = ZEXT3264(local_880);
                auVar262 = ZEXT3264(local_8c0);
                auVar263 = ZEXT3264(local_9a0);
                auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar212,local_8a0._0_16_);
                auVar81 = vfmadd231ss_fma(auVar212,local_8a0._0_16_,SUB6416(ZEXT464(0xc0000000),0));
                fVar140 = local_8a0._0_4_;
                auVar190._0_4_ = fVar140 * (float)local_6a0._0_4_;
                auVar190._4_4_ = fVar140 * (float)local_6a0._4_4_;
                auVar190._8_4_ = fVar140 * fStack_698;
                auVar190._12_4_ = fVar140 * fStack_694;
                auVar207._0_4_ = auVar81._0_4_;
                auVar207._4_4_ = auVar207._0_4_;
                auVar207._8_4_ = auVar207._0_4_;
                auVar207._12_4_ = auVar207._0_4_;
                auVar81 = vfmadd132ps_fma(auVar207,auVar190,local_660._0_16_);
                auVar170._0_4_ = auVar88._0_4_;
                auVar170._4_4_ = auVar170._0_4_;
                auVar170._8_4_ = auVar170._0_4_;
                auVar170._12_4_ = auVar170._0_4_;
                auVar81 = vfmadd132ps_fma(auVar170,auVar81,local_680._0_16_);
                auVar81 = vfmadd132ps_fma(_local_560,auVar81,local_640._0_16_);
                auVar171._0_4_ = auVar81._0_4_ * (float)local_580._0_4_;
                auVar171._4_4_ = auVar81._4_4_ * (float)local_580._0_4_;
                auVar171._8_4_ = auVar81._8_4_ * (float)local_580._0_4_;
                auVar171._12_4_ = auVar81._12_4_ * (float)local_580._0_4_;
                auVar81 = vdpps_avx(auVar84,auVar81,0x7f);
                fVar203 = auVar81._0_4_;
                auVar191._0_4_ = auVar84._0_4_ * fVar203;
                auVar191._4_4_ = auVar84._4_4_ * fVar203;
                auVar191._8_4_ = auVar84._8_4_ * fVar203;
                auVar191._12_4_ = auVar84._12_4_ * fVar203;
                auVar81 = vsubps_avx(auVar171,auVar191);
                fVar203 = (float)local_770._0_4_ * (float)local_5a0._0_4_;
                auVar19._8_4_ = 0x80000000;
                auVar19._0_8_ = 0x8000000080000000;
                auVar19._12_4_ = 0x80000000;
                auVar87 = vxorps_avx512vl(auVar84,auVar19);
                auVar216._0_4_ = fVar232 * auVar81._0_4_ * fVar203;
                auVar216._4_4_ = fVar208 * auVar81._4_4_ * fVar203;
                auVar216._8_4_ = fVar209 * auVar81._8_4_ * fVar203;
                auVar216._12_4_ = fVar210 * auVar81._12_4_ * fVar203;
                auVar81 = vdpps_avx(auVar87,auVar250,0x7f);
                auVar212 = vmaxss_avx(ZEXT416((uint)fVar211),
                                      ZEXT416((uint)((float)local_7a0._0_4_ *
                                                    fVar220 * 1.9073486e-06)));
                auVar88 = vdivss_avx512f(ZEXT416((uint)fVar211),auVar85);
                auVar85 = vdpps_avx(local_6e0._0_16_,auVar216,0x7f);
                auVar83 = vfmadd213ss_fma(auVar83,ZEXT416((uint)fVar211),auVar212);
                auVar88 = vfmadd213ss_fma(ZEXT416((uint)(fVar237 + 1.0)),auVar88,auVar83);
                auVar83 = vdpps_avx(local_6b0,auVar250,0x7f);
                fVar232 = auVar81._0_4_ + auVar85._0_4_;
                auVar85 = vdpps_avx(local_6e0._0_16_,auVar87,0x7f);
                auVar87 = vmulss_avx512f(auVar86,ZEXT416((uint)(fVar236 * -0.5)));
                auVar86 = vmulss_avx512f(auVar86,auVar86);
                auVar81 = vdpps_avx(local_6e0._0_16_,local_6b0,0x7f);
                auVar87 = vaddss_avx512f(auVar82,ZEXT416((uint)(auVar87._0_4_ * auVar86._0_4_)));
                auVar86 = vfnmadd231ss_fma(auVar85,auVar89,ZEXT416((uint)fVar232));
                auVar82 = vfnmadd231ss_fma(auVar81,auVar89,auVar83);
                auVar85 = vpermilps_avx(local_540._0_16_,0xff);
                fVar221 = fVar221 - auVar85._0_4_;
                auVar85 = vshufps_avx(auVar84,auVar84,0xff);
                auVar81 = vfmsub213ss_fma(auVar86,auVar87,auVar85);
                fVar236 = auVar82._0_4_ * auVar87._0_4_;
                auVar86 = vfmsub231ss_fma(ZEXT416((uint)(auVar83._0_4_ * auVar81._0_4_)),
                                          ZEXT416((uint)fVar232),ZEXT416((uint)fVar236));
                fVar237 = auVar86._0_4_;
                fVar140 = fVar140 - (fVar235 * (fVar236 / fVar237) -
                                    fVar221 * (auVar83._0_4_ / fVar237));
                auVar225 = ZEXT464((uint)fVar140);
                fVar222 = (float)local_7a0._0_4_ -
                          (fVar221 * (fVar232 / fVar237) - fVar235 * (auVar81._0_4_ / fVar237));
                auVar234 = ZEXT464((uint)fVar222);
                auVar20._8_4_ = 0x7fffffff;
                auVar20._0_8_ = 0x7fffffff7fffffff;
                auVar20._12_4_ = 0x7fffffff;
                auVar83 = vandps_avx512vl(auVar89,auVar20);
                fVar232 = (float)local_9c0._0_4_;
                fVar235 = (float)local_9c0._4_4_;
                fVar236 = fStack_9b8;
                fVar237 = fStack_9b4;
                fVar208 = fStack_9b0;
                fVar209 = fStack_9ac;
                fVar210 = fStack_9a8;
                fVar203 = fStack_9a4;
                if (auVar83._0_4_ < auVar88._0_4_) {
                  auVar83 = vfmadd231ss_fma(ZEXT416((uint)(auVar88._0_4_ + auVar212._0_4_)),
                                            local_610,ZEXT416(0x36000000));
                  auVar21._8_4_ = 0x7fffffff;
                  auVar21._0_8_ = 0x7fffffff7fffffff;
                  auVar21._12_4_ = 0x7fffffff;
                  auVar89 = vandps_avx512vl(ZEXT416((uint)fVar221),auVar21);
                  if (auVar89._0_4_ < auVar83._0_4_) {
                    fVar222 = fVar222 + (float)local_620._0_4_;
                    auVar225 = ZEXT3264(CONCAT428(0x3f800000,
                                                  CONCAT424(0x3f800000,
                                                            CONCAT420(0x3f800000,
                                                                      CONCAT416(0x3f800000,
                                                                                CONCAT412(0x3f800000
                                                                                          ,CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                    if (fVar222 < fVar139) {
                      bVar73 = 0;
                      goto LAB_01ca8fc4;
                    }
                    fVar220 = *(float *)(ray + k * 4 + 0x80);
                    auVar234 = ZEXT464((uint)fVar220);
                    auVar231 = ZEXT3264(_local_720);
                    if (fVar222 <= fVar220) {
                      bVar73 = 0;
                      if ((fVar140 < 0.0) || (1.0 < fVar140)) goto LAB_01ca8fcd;
                      auVar192._4_12_ = SUB1612(ZEXT816(0),0);
                      auVar192._0_4_ = local_700._0_4_;
                      auVar83 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar192);
                      fVar221 = auVar83._0_4_;
                      pGVar2 = (context->scene->geometries).items[local_758].ptr;
                      if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                        bVar73 = 0;
                        goto LAB_01ca8fcd;
                      }
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar73 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_01ca8fcd;
                      fVar221 = fVar221 * 1.5 + local_700._0_4_ * -0.5 * fVar221 * fVar221 * fVar221
                      ;
                      auVar193._0_4_ = local_6e0._0_4_ * fVar221;
                      auVar193._4_4_ = local_6e0._4_4_ * fVar221;
                      auVar193._8_4_ = local_6e0._8_4_ * fVar221;
                      auVar193._12_4_ = local_6e0._12_4_ * fVar221;
                      auVar81 = vfmadd213ps_fma(auVar85,auVar193,auVar84);
                      auVar83 = vshufps_avx(auVar193,auVar193,0xc9);
                      auVar85 = vshufps_avx(auVar84,auVar84,0xc9);
                      auVar194._0_4_ = auVar193._0_4_ * auVar85._0_4_;
                      auVar194._4_4_ = auVar193._4_4_ * auVar85._4_4_;
                      auVar194._8_4_ = auVar193._8_4_ * auVar85._8_4_;
                      auVar194._12_4_ = auVar193._12_4_ * auVar85._12_4_;
                      auVar89 = vfmsub231ps_fma(auVar194,auVar84,auVar83);
                      auVar83 = vshufps_avx(auVar89,auVar89,0xc9);
                      auVar85 = vshufps_avx(auVar81,auVar81,0xc9);
                      auVar89 = vshufps_avx(auVar89,auVar89,0xd2);
                      auVar147._0_4_ = auVar81._0_4_ * auVar89._0_4_;
                      auVar147._4_4_ = auVar81._4_4_ * auVar89._4_4_;
                      auVar147._8_4_ = auVar81._8_4_ * auVar89._8_4_;
                      auVar147._12_4_ = auVar81._12_4_ * auVar89._12_4_;
                      auVar83 = vfmsub231ps_fma(auVar147,auVar83,auVar85);
                      local_4e0 = (RTCHitN  [16])vshufps_avx(auVar83,auVar83,0x55);
                      auStack_4d0 = vshufps_avx(auVar83,auVar83,0xaa);
                      local_4c0 = auVar83._0_4_;
                      uStack_4bc = local_4c0;
                      uStack_4b8 = local_4c0;
                      uStack_4b4 = local_4c0;
                      local_4b0 = fVar140;
                      fStack_4ac = fVar140;
                      fStack_4a8 = fVar140;
                      fStack_4a4 = fVar140;
                      local_4a0 = ZEXT416(0) << 0x20;
                      local_490 = local_4f0._0_8_;
                      uStack_488 = local_4f0._8_8_;
                      local_480 = local_500;
                      vpcmpeqd_avx2(ZEXT1632(local_500),ZEXT1632(local_500));
                      uStack_46c = context->user->instID[0];
                      local_470 = uStack_46c;
                      uStack_468 = uStack_46c;
                      uStack_464 = uStack_46c;
                      uStack_460 = context->user->instPrimID[0];
                      uStack_45c = uStack_460;
                      uStack_458 = uStack_460;
                      uStack_454 = uStack_460;
                      *(float *)(ray + k * 4 + 0x80) = fVar222;
                      local_9e0 = local_510;
                      local_750.valid = (int *)local_9e0;
                      local_750.geometryUserPtr = pGVar2->userPtr;
                      local_750.context = context->user;
                      local_750.hit = local_4e0;
                      local_750.N = 4;
                      local_750.ray = (RTCRayN *)ray;
                      if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar238 = ZEXT1664(local_6e0._0_16_);
                        auVar242 = ZEXT1664(local_700._0_16_);
                        auVar247 = ZEXT1664(auVar84);
                        (*pGVar2->occlusionFilterN)(&local_750);
                        auVar231 = ZEXT3264(_local_720);
                        auVar263 = ZEXT3264(local_9a0);
                        auVar262 = ZEXT3264(local_8c0);
                        auVar261 = ZEXT3264(local_880);
                        auVar260 = ZEXT3264(local_860);
                        auVar258 = ZEXT3264(local_840);
                        auVar257 = ZEXT3264(local_980);
                        auVar256 = ZEXT3264(local_820);
                        auVar255 = ZEXT3264(local_960);
                        auVar254 = ZEXT3264(local_800);
                        auVar253 = ZEXT3264(local_940);
                        auVar252 = ZEXT3264(local_920);
                        auVar251 = ZEXT3264(local_900);
                        auVar259 = ZEXT3264(local_8e0);
                        auVar225 = ZEXT3264(CONCAT428(0x3f800000,
                                                      CONCAT424(0x3f800000,
                                                                CONCAT420(0x3f800000,
                                                                          CONCAT416(0x3f800000,
                                                                                    CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                        fVar232 = (float)local_9c0._0_4_;
                        fVar235 = (float)local_9c0._4_4_;
                        fVar236 = fStack_9b8;
                        fVar237 = fStack_9b4;
                        fVar208 = fStack_9b0;
                        fVar209 = fStack_9ac;
                        fVar210 = fStack_9a8;
                        fVar203 = fStack_9a4;
                      }
                      uVar79 = vptestmd_avx512vl(local_9e0,local_9e0);
                      if ((uVar79 & 0xf) != 0) {
                        p_Var3 = context->args->filter;
                        if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar238 = ZEXT1664(auVar238._0_16_);
                          auVar242 = ZEXT1664(auVar242._0_16_);
                          auVar247 = ZEXT1664(auVar247._0_16_);
                          (*p_Var3)(&local_750);
                          auVar231 = ZEXT3264(_local_720);
                          auVar263 = ZEXT3264(local_9a0);
                          auVar262 = ZEXT3264(local_8c0);
                          auVar261 = ZEXT3264(local_880);
                          auVar260 = ZEXT3264(local_860);
                          auVar258 = ZEXT3264(local_840);
                          auVar257 = ZEXT3264(local_980);
                          auVar256 = ZEXT3264(local_820);
                          auVar255 = ZEXT3264(local_960);
                          auVar254 = ZEXT3264(local_800);
                          auVar253 = ZEXT3264(local_940);
                          auVar252 = ZEXT3264(local_920);
                          auVar251 = ZEXT3264(local_900);
                          auVar259 = ZEXT3264(local_8e0);
                          auVar225 = ZEXT3264(CONCAT428(0x3f800000,
                                                        CONCAT424(0x3f800000,
                                                                  CONCAT420(0x3f800000,
                                                                            CONCAT416(0x3f800000,
                                                                                      CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                          fVar232 = (float)local_9c0._0_4_;
                          fVar235 = (float)local_9c0._4_4_;
                          fVar236 = fStack_9b8;
                          fVar237 = fStack_9b4;
                          fVar208 = fStack_9b0;
                          fVar209 = fStack_9ac;
                          fVar210 = fStack_9a8;
                          fVar203 = fStack_9a4;
                        }
                        auVar234 = ZEXT464((uint)fVar220);
                        uVar79 = vptestmd_avx512vl(local_9e0,local_9e0);
                        uVar79 = uVar79 & 0xf;
                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar4 = (bool)((byte)uVar79 & 1);
                        auVar90._0_4_ =
                             (uint)bVar4 * auVar83._0_4_ |
                             (uint)!bVar4 * *(int *)(local_750.ray + 0x80);
                        bVar4 = (bool)((byte)(uVar79 >> 1) & 1);
                        auVar90._4_4_ =
                             (uint)bVar4 * auVar83._4_4_ |
                             (uint)!bVar4 * *(int *)(local_750.ray + 0x84);
                        bVar4 = (bool)((byte)(uVar79 >> 2) & 1);
                        auVar90._8_4_ =
                             (uint)bVar4 * auVar83._8_4_ |
                             (uint)!bVar4 * *(int *)(local_750.ray + 0x88);
                        bVar4 = SUB81(uVar79 >> 3,0);
                        auVar90._12_4_ =
                             (uint)bVar4 * auVar83._12_4_ |
                             (uint)!bVar4 * *(int *)(local_750.ray + 0x8c);
                        *(undefined1 (*) [16])(local_750.ray + 0x80) = auVar90;
                        bVar73 = 1;
                        if ((byte)uVar79 != 0) goto LAB_01ca8fcd;
                      }
                      *(float *)(ray + k * 4 + 0x80) = fVar220;
                    }
                    auVar234 = ZEXT464((uint)fVar220);
                    bVar73 = 0;
                    goto LAB_01ca8fcd;
                  }
                }
                bVar78 = uVar79 < 4;
                uVar79 = uVar79 + 1;
              } while (uVar79 != 5);
              bVar78 = false;
              auVar225 = ZEXT3264(CONCAT428(0x3f800000,
                                            CONCAT424(0x3f800000,
                                                      CONCAT420(0x3f800000,
                                                                CONCAT416(0x3f800000,
                                                                          CONCAT412(0x3f800000,
                                                                                    CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
              bVar73 = 5;
LAB_01ca8fc4:
              auVar231 = ZEXT3264(_local_720);
LAB_01ca8fcd:
              bVar77 = (bool)(bVar77 | bVar78 & bVar73);
              uVar160 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar152._4_4_ = uVar160;
              auVar152._0_4_ = uVar160;
              auVar152._8_4_ = uVar160;
              auVar152._12_4_ = uVar160;
              auVar152._16_4_ = uVar160;
              auVar152._20_4_ = uVar160;
              auVar152._24_4_ = uVar160;
              auVar152._28_4_ = uVar160;
              auVar64._4_4_ = fStack_3bc;
              auVar64._0_4_ = local_3c0;
              auVar64._8_4_ = fStack_3b8;
              auVar64._12_4_ = fStack_3b4;
              auVar64._16_4_ = fStack_3b0;
              auVar64._20_4_ = fStack_3ac;
              auVar64._24_4_ = fStack_3a8;
              auVar64._28_4_ = fStack_3a4;
              uVar11 = vcmpps_avx512vl(auVar152,auVar64,0xd);
              bVar67 = ~('\x01' << ((byte)iVar15 & 0x1f)) & bVar67 & (byte)uVar11;
            } while (bVar67 != 0);
            auVar231 = ZEXT3264(local_360);
            auVar129 = local_3e0;
          }
          uVar13 = vpcmpgtd_avx512vl(auVar129,local_380);
          uVar14 = vpcmpd_avx512vl(local_380,local_300,1);
          auVar198._0_4_ = fVar232 + (float)local_1c0._0_4_;
          auVar198._4_4_ = fVar235 + (float)local_1c0._4_4_;
          auVar198._8_4_ = fVar236 + fStack_1b8;
          auVar198._12_4_ = fVar237 + fStack_1b4;
          auVar198._16_4_ = fVar208 + fStack_1b0;
          auVar198._20_4_ = fVar209 + fStack_1ac;
          auVar198._24_4_ = fVar210 + fStack_1a8;
          auVar198._28_4_ = fVar203 + fStack_1a4;
          uVar11 = vcmpps_avx512vl(auVar198,auVar152,2);
          bVar71 = bVar71 & (byte)uVar14 & (byte)uVar11;
          auVar199._0_4_ = fVar232 + auVar231._0_4_;
          auVar199._4_4_ = fVar235 + auVar231._4_4_;
          auVar199._8_4_ = fVar236 + auVar231._8_4_;
          auVar199._12_4_ = fVar237 + auVar231._12_4_;
          auVar199._16_4_ = fVar208 + auVar231._16_4_;
          auVar199._20_4_ = fVar209 + auVar231._20_4_;
          auVar199._24_4_ = fVar210 + auVar231._24_4_;
          auVar199._28_4_ = fVar203 + auVar231._28_4_;
          uVar11 = vcmpps_avx512vl(auVar199,auVar152,2);
          bVar67 = bVar74 & (byte)uVar13 & (byte)uVar11 | bVar71;
          prim = local_5b0;
          pPVar75 = local_5b8;
          if (bVar67 != 0) {
            abStack_180[uVar69 * 0x60] = bVar67;
            auVar131._0_4_ =
                 (uint)(bVar71 & 1) * local_1c0._0_4_ |
                 (uint)!(bool)(bVar71 & 1) * (int)auVar231._0_4_;
            bVar78 = (bool)(bVar71 >> 1 & 1);
            auVar131._4_4_ = (uint)bVar78 * local_1c0._4_4_ | (uint)!bVar78 * (int)auVar231._4_4_;
            bVar78 = (bool)(bVar71 >> 2 & 1);
            auVar131._8_4_ = (uint)bVar78 * (int)fStack_1b8 | (uint)!bVar78 * (int)auVar231._8_4_;
            bVar78 = (bool)(bVar71 >> 3 & 1);
            auVar131._12_4_ = (uint)bVar78 * (int)fStack_1b4 | (uint)!bVar78 * (int)auVar231._12_4_;
            bVar78 = (bool)(bVar71 >> 4 & 1);
            auVar131._16_4_ = (uint)bVar78 * (int)fStack_1b0 | (uint)!bVar78 * (int)auVar231._16_4_;
            bVar78 = (bool)(bVar71 >> 5 & 1);
            auVar131._20_4_ = (uint)bVar78 * (int)fStack_1ac | (uint)!bVar78 * (int)auVar231._20_4_;
            auVar131._24_4_ =
                 (uint)(bVar71 >> 6) * (int)fStack_1a8 |
                 (uint)!(bool)(bVar71 >> 6) * (int)auVar231._24_4_;
            auVar131._28_4_ = auVar231._28_4_;
            auVar231 = ZEXT3264(auVar131);
            *(undefined1 (*) [32])(auStack_160 + uVar69 * 0x60) = auVar131;
            uVar79 = vmovlps_avx(local_390);
            (&uStack_140)[uVar69 * 0xc] = uVar79;
            aiStack_138[uVar69 * 0x18] = local_9cc + 1;
            uVar69 = (ulong)((int)uVar69 + 1);
          }
        }
      }
    }
    do {
      uVar76 = (uint)uVar69;
      uVar69 = (ulong)(uVar76 - 1);
      if (uVar76 == 0) {
        if (bVar77 != false) {
          return bVar77;
        }
        uVar160 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar33._4_4_ = uVar160;
        auVar33._0_4_ = uVar160;
        auVar33._8_4_ = uVar160;
        auVar33._12_4_ = uVar160;
        auVar33._16_4_ = uVar160;
        auVar33._20_4_ = uVar160;
        auVar33._24_4_ = uVar160;
        auVar33._28_4_ = uVar160;
        uVar11 = vcmpps_avx512vl(local_2e0,auVar33,2);
        uVar76 = (uint)local_5a8 & (uint)uVar11;
        local_5a8 = (ulong)uVar76;
        if (uVar76 == 0) {
          return false;
        }
        goto LAB_01ca6b4d;
      }
      lVar70 = uVar69 * 0x60;
      auVar96 = *(undefined1 (*) [32])(auStack_160 + lVar70);
      auVar172._0_4_ = fVar232 + auVar96._0_4_;
      auVar172._4_4_ = fVar235 + auVar96._4_4_;
      auVar172._8_4_ = fVar236 + auVar96._8_4_;
      auVar172._12_4_ = fVar237 + auVar96._12_4_;
      auVar172._16_4_ = fVar208 + auVar96._16_4_;
      auVar172._20_4_ = fVar209 + auVar96._20_4_;
      auVar172._24_4_ = fVar210 + auVar96._24_4_;
      auVar172._28_4_ = fVar203 + auVar96._28_4_;
      uVar160 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar32._4_4_ = uVar160;
      auVar32._0_4_ = uVar160;
      auVar32._8_4_ = uVar160;
      auVar32._12_4_ = uVar160;
      auVar32._16_4_ = uVar160;
      auVar32._20_4_ = uVar160;
      auVar32._24_4_ = uVar160;
      auVar32._28_4_ = uVar160;
      uVar11 = vcmpps_avx512vl(auVar172,auVar32,2);
      uVar80 = (uint)uVar11 & (uint)abStack_180[lVar70];
    } while (uVar80 == 0);
    uVar79 = (&uStack_140)[uVar69 * 0xc];
    auVar161._8_8_ = 0;
    auVar161._0_8_ = uVar79;
    auVar197._8_4_ = 0x7f800000;
    auVar197._0_8_ = 0x7f8000007f800000;
    auVar197._12_4_ = 0x7f800000;
    auVar197._16_4_ = 0x7f800000;
    auVar197._20_4_ = 0x7f800000;
    auVar197._24_4_ = 0x7f800000;
    auVar197._28_4_ = 0x7f800000;
    auVar94 = vblendmps_avx512vl(auVar197,auVar96);
    bVar67 = (byte)uVar80;
    auVar127._0_4_ =
         (uint)(bVar67 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar67 & 1) * (int)auVar96._0_4_;
    bVar78 = (bool)((byte)(uVar80 >> 1) & 1);
    auVar127._4_4_ = (uint)bVar78 * auVar94._4_4_ | (uint)!bVar78 * (int)auVar96._4_4_;
    bVar78 = (bool)((byte)(uVar80 >> 2) & 1);
    auVar127._8_4_ = (uint)bVar78 * auVar94._8_4_ | (uint)!bVar78 * (int)auVar96._8_4_;
    bVar78 = (bool)((byte)(uVar80 >> 3) & 1);
    auVar127._12_4_ = (uint)bVar78 * auVar94._12_4_ | (uint)!bVar78 * (int)auVar96._12_4_;
    bVar78 = (bool)((byte)(uVar80 >> 4) & 1);
    auVar127._16_4_ = (uint)bVar78 * auVar94._16_4_ | (uint)!bVar78 * (int)auVar96._16_4_;
    bVar78 = (bool)((byte)(uVar80 >> 5) & 1);
    auVar127._20_4_ = (uint)bVar78 * auVar94._20_4_ | (uint)!bVar78 * (int)auVar96._20_4_;
    bVar78 = (bool)((byte)(uVar80 >> 6) & 1);
    auVar127._24_4_ = (uint)bVar78 * auVar94._24_4_ | (uint)!bVar78 * (int)auVar96._24_4_;
    auVar127._28_4_ =
         (uVar80 >> 7) * auVar94._28_4_ | (uint)!SUB41(uVar80 >> 7,0) * (int)auVar96._28_4_;
    auVar96 = vshufps_avx(auVar127,auVar127,0xb1);
    auVar96 = vminps_avx(auVar127,auVar96);
    auVar94 = vshufpd_avx(auVar96,auVar96,5);
    auVar96 = vminps_avx(auVar96,auVar94);
    auVar94 = vpermpd_avx2(auVar96,0x4e);
    auVar96 = vminps_avx(auVar96,auVar94);
    uVar11 = vcmpps_avx512vl(auVar127,auVar96,0);
    bVar71 = (byte)uVar11 & bVar67;
    if (bVar71 != 0) {
      uVar80 = (uint)bVar71;
    }
    uVar132 = 0;
    for (; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x80000000) {
      uVar132 = uVar132 + 1;
    }
    local_9cc = aiStack_138[uVar69 * 0x18];
    bVar67 = ~('\x01' << ((byte)uVar132 & 0x1f)) & bVar67;
    abStack_180[lVar70] = bVar67;
    if (bVar67 == 0) {
      uVar76 = uVar76 - 1;
    }
    uVar160 = (undefined4)uVar79;
    auVar149._4_4_ = uVar160;
    auVar149._0_4_ = uVar160;
    auVar149._8_4_ = uVar160;
    auVar149._12_4_ = uVar160;
    auVar149._16_4_ = uVar160;
    auVar149._20_4_ = uVar160;
    auVar149._24_4_ = uVar160;
    auVar149._28_4_ = uVar160;
    auVar83 = vmovshdup_avx(auVar161);
    auVar83 = vsubps_avx(auVar83,auVar161);
    auVar173._0_4_ = auVar83._0_4_;
    auVar173._4_4_ = auVar173._0_4_;
    auVar173._8_4_ = auVar173._0_4_;
    auVar173._12_4_ = auVar173._0_4_;
    auVar173._16_4_ = auVar173._0_4_;
    auVar173._20_4_ = auVar173._0_4_;
    auVar173._24_4_ = auVar173._0_4_;
    auVar173._28_4_ = auVar173._0_4_;
    auVar83 = vfmadd132ps_fma(auVar173,auVar149,_DAT_01faff20);
    _local_4e0 = ZEXT1632(auVar83);
    local_390._8_8_ = 0;
    local_390._0_8_ = *(ulong *)(local_4e0 + (ulong)uVar132 * 4);
    uVar69 = (ulong)uVar76;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }